

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O3

void __thiscall cnn::AdamTrainer::update(AdamTrainer *this,real scale)

{
  float fVar1;
  real rVar2;
  uint uVar3;
  pointer pSVar4;
  Parameters *pPVar5;
  pointer pSVar6;
  float *pfVar7;
  pointer pTVar8;
  float *pfVar9;
  float *pfVar10;
  LookupParameters *this_00;
  long lVar11;
  pointer pTVar12;
  pointer pTVar13;
  bool bVar14;
  byte bVar15;
  float fVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  byte bVar22;
  pointer pSVar23;
  uint uVar24;
  Index size_1;
  Model *pMVar25;
  pointer ppLVar26;
  char *__function;
  Index index;
  _Hash_node_base *p_Var27;
  Index index_1;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  uint uVar36;
  pointer pSVar37;
  uint uVar38;
  ushort uVar39;
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar40 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar42 [16];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  double dVar71;
  float fVar72;
  undefined1 auVar73 [16];
  undefined1 in_ZMM8 [64];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_XMM25 [16];
  Index size;
  Index size_2;
  ulong local_1a0;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined4 uStack_178;
  undefined4 uStack_174;
  double local_170;
  pointer local_168;
  pointer local_160;
  pointer local_158;
  _Hash_node_base *local_150;
  vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> local_148;
  pointer local_128;
  double local_118;
  float local_110;
  float local_108;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  pointer local_c0;
  undefined1 local_b8 [64];
  undefined1 local_78 [64];
  
  if (this->shadow_params_allocated == false) {
    AllocateShadowParameters
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_188,
               (this->super_Trainer).model);
    pSVar4 = (this->m).
             super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(uStack_174,uStack_178);
    local_148.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)(this->m).
                  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    pSVar6 = (this->m).
             super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    (this->m).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(fStack_184,local_188);
    (this->m).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)CONCAT44(fStack_17c,fStack_180);
    local_188 = 0.0;
    uStack_178 = 0;
    uStack_174 = 0;
    fStack_184 = 0.0;
    fStack_180 = 0.0;
    fStack_17c = 0.0;
    local_148.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = SUB84(pSVar6,0);
    local_148.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)pSVar6 >> 0x20);
    local_148.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = SUB84(pSVar4,0);
    local_148.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)((ulong)pSVar4 >> 0x20);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_148);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_188);
    AllocateShadowLookupParameters
              ((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)
               &local_188,(this->super_Trainer).model);
    pSVar37 = (this->lm).
              super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->lm).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(uStack_174,uStack_178);
    local_148.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (this->lm).
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_start;
    pSVar23 = (this->lm).
              super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    (this->lm).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(fStack_184,local_188);
    (this->lm).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)CONCAT44(fStack_17c,fStack_180);
    local_188 = 0.0;
    uStack_178 = 0;
    uStack_174 = 0;
    fStack_184 = 0.0;
    fStack_180 = 0.0;
    fStack_17c = 0.0;
    local_148.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = SUB84(pSVar23,0);
    local_148.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)pSVar23 >> 0x20);
    local_148.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = SUB84(pSVar37,0);
    local_148.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)((ulong)pSVar37 >> 0x20);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              (&local_148);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              ((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)
               &local_188);
    AllocateShadowParameters
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_188,
               (this->super_Trainer).model);
    pSVar4 = (this->v).
             super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->v).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(uStack_174,uStack_178);
    local_148.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)(this->v).
                  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    pSVar6 = (this->v).
             super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    (this->v).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(fStack_184,local_188);
    (this->v).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)CONCAT44(fStack_17c,fStack_180);
    local_188 = 0.0;
    uStack_178 = 0;
    uStack_174 = 0;
    fStack_184 = 0.0;
    fStack_180 = 0.0;
    fStack_17c = 0.0;
    local_148.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = SUB84(pSVar6,0);
    local_148.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)pSVar6 >> 0x20);
    local_148.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = SUB84(pSVar4,0);
    local_148.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)((ulong)pSVar4 >> 0x20);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_148);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_188);
    AllocateShadowLookupParameters
              ((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)
               &local_188,(this->super_Trainer).model);
    pSVar37 = (this->lv).
              super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->lv).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(uStack_174,uStack_178);
    local_148.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (this->lv).
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_start;
    pSVar23 = (this->lv).
              super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    (this->lv).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(fStack_184,local_188);
    (this->lv).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)CONCAT44(fStack_17c,fStack_180);
    local_188 = 0.0;
    uStack_178 = 0;
    uStack_174 = 0;
    fStack_184 = 0.0;
    fStack_180 = 0.0;
    fStack_17c = 0.0;
    local_148.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = SUB84(pSVar23,0);
    local_148.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)pSVar23 >> 0x20);
    local_148.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = SUB84(pSVar37,0);
    local_148.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)((ulong)pSVar37 >> 0x20);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              (&local_148);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              ((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)
               &local_188);
    this->shadow_params_allocated = true;
  }
  local_168._0_4_ = Trainer::clip_gradients(&this->super_Trainer);
  pMVar25 = (this->super_Trainer).model;
  local_158 = (pointer)(pMVar25->params).
                       super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
  pSVar37 = (pointer)(pMVar25->params).
                     super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
  if (pSVar37 != local_158) {
    fVar72 = local_168._0_4_ * scale;
    auVar45 = vbroadcasti64x4_avx512f(_DAT_002e6e00);
    auVar46 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar47 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    p_Var27 = (_Hash_node_base *)0x0;
    local_78 = vmovdqu64_avx512f(auVar45);
    local_b8._0_16_ = ZEXT416((uint)fVar72);
    local_160 = (pointer)CONCAT44(local_160._4_4_,fVar72 * fVar72);
    do {
      pPVar5 = *(Parameters **)
                &(pSVar37->h).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl;
      iVar68 = 1;
      iVar67 = 1;
      uVar24 = update::t + 1;
      uVar29 = (ulong)(pPVar5->g).d.nd;
      if (uVar29 != 0) {
        auVar45 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar48 = vpbroadcastq_avx512f();
        uVar30 = 0;
        do {
          auVar49 = vpbroadcastq_avx512f();
          auVar50 = vmovdqa64_avx512f(auVar45);
          auVar45 = vporq_avx512f(auVar49,auVar46);
          auVar49 = vporq_avx512f(auVar49,auVar47);
          uVar17 = vpcmpuq_avx512f(auVar49,auVar48,2);
          bVar15 = (byte)uVar17;
          uVar17 = vpcmpuq_avx512f(auVar45,auVar48,2);
          bVar22 = (byte)uVar17;
          uVar39 = CONCAT11(bVar22,bVar15);
          auVar45 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pPVar5->g).d.d + uVar30));
          auVar49._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * auVar45._4_4_;
          auVar49._0_4_ = (uint)(bVar15 & 1) * auVar45._0_4_;
          auVar49._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * auVar45._8_4_;
          auVar49._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * auVar45._12_4_;
          auVar49._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * auVar45._16_4_;
          auVar49._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * auVar45._20_4_;
          auVar49._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * auVar45._24_4_;
          auVar49._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * auVar45._28_4_;
          auVar49._32_4_ = (uint)(bVar22 & 1) * auVar45._32_4_;
          auVar49._36_4_ = (uint)(bVar22 >> 1 & 1) * auVar45._36_4_;
          auVar49._40_4_ = (uint)(bVar22 >> 2 & 1) * auVar45._40_4_;
          auVar49._44_4_ = (uint)(bVar22 >> 3 & 1) * auVar45._44_4_;
          auVar49._48_4_ = (uint)(bVar22 >> 4 & 1) * auVar45._48_4_;
          auVar49._52_4_ = (uint)(bVar22 >> 5 & 1) * auVar45._52_4_;
          auVar49._56_4_ = (uint)(bVar22 >> 6 & 1) * auVar45._56_4_;
          auVar49._60_4_ = (uint)(bVar22 >> 7) * auVar45._60_4_;
          uVar30 = uVar30 + 0x10;
          auVar45 = vpmulld_avx512f(auVar49,auVar50);
        } while ((uVar29 + 0xf & 0x1fffffff0) != uVar30);
        auVar45 = vmovdqa32_avx512f(auVar45);
        auVar48._0_4_ =
             (uint)(bVar15 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar50._0_4_;
        bVar14 = (bool)((byte)(uVar39 >> 1) & 1);
        auVar48._4_4_ = (uint)bVar14 * auVar45._4_4_ | (uint)!bVar14 * auVar50._4_4_;
        bVar14 = (bool)((byte)(uVar39 >> 2) & 1);
        auVar48._8_4_ = (uint)bVar14 * auVar45._8_4_ | (uint)!bVar14 * auVar50._8_4_;
        bVar14 = (bool)((byte)(uVar39 >> 3) & 1);
        auVar48._12_4_ = (uint)bVar14 * auVar45._12_4_ | (uint)!bVar14 * auVar50._12_4_;
        bVar14 = (bool)((byte)(uVar39 >> 4) & 1);
        auVar48._16_4_ = (uint)bVar14 * auVar45._16_4_ | (uint)!bVar14 * auVar50._16_4_;
        bVar14 = (bool)((byte)(uVar39 >> 5) & 1);
        auVar48._20_4_ = (uint)bVar14 * auVar45._20_4_ | (uint)!bVar14 * auVar50._20_4_;
        bVar14 = (bool)((byte)(uVar39 >> 6) & 1);
        auVar48._24_4_ = (uint)bVar14 * auVar45._24_4_ | (uint)!bVar14 * auVar50._24_4_;
        bVar14 = (bool)((byte)(uVar39 >> 7) & 1);
        auVar48._28_4_ = (uint)bVar14 * auVar45._28_4_ | (uint)!bVar14 * auVar50._28_4_;
        auVar48._32_4_ =
             (uint)(bVar22 & 1) * auVar45._32_4_ | (uint)!(bool)(bVar22 & 1) * auVar50._32_4_;
        bVar14 = (bool)(bVar22 >> 1 & 1);
        auVar48._36_4_ = (uint)bVar14 * auVar45._36_4_ | (uint)!bVar14 * auVar50._36_4_;
        bVar14 = (bool)(bVar22 >> 2 & 1);
        auVar48._40_4_ = (uint)bVar14 * auVar45._40_4_ | (uint)!bVar14 * auVar50._40_4_;
        bVar14 = (bool)(bVar22 >> 3 & 1);
        auVar48._44_4_ = (uint)bVar14 * auVar45._44_4_ | (uint)!bVar14 * auVar50._44_4_;
        bVar14 = (bool)(bVar22 >> 4 & 1);
        auVar48._48_4_ = (uint)bVar14 * auVar45._48_4_ | (uint)!bVar14 * auVar50._48_4_;
        bVar14 = (bool)(bVar22 >> 5 & 1);
        auVar48._52_4_ = (uint)bVar14 * auVar45._52_4_ | (uint)!bVar14 * auVar50._52_4_;
        bVar14 = (bool)(bVar22 >> 6 & 1);
        auVar48._56_4_ = (uint)bVar14 * auVar45._56_4_ | (uint)!bVar14 * auVar50._56_4_;
        auVar48._60_4_ =
             (uint)(bVar22 >> 7) * auVar45._60_4_ | (uint)!(bool)(bVar22 >> 7) * auVar50._60_4_;
        auVar44 = vextracti64x4_avx512f(auVar48,1);
        auVar45 = vpmulld_avx512f(auVar48,ZEXT3264(auVar44));
        auVar41 = vpmulld_avx(auVar45._0_16_,auVar45._16_16_);
        auVar40 = vpshufd_avx(auVar41,0xee);
        auVar41 = vpmulld_avx(auVar41,auVar40);
        auVar40 = vpshufd_avx(auVar41,0x55);
        auVar41 = vpmulld_avx(auVar41,auVar40);
        iVar67 = auVar41._0_4_;
      }
      pSVar4 = (this->m).
               super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar29 = (ulong)pSVar4[(long)p_Var27].h.d.nd;
      if (uVar29 != 0) {
        auVar45 = vpbroadcastd_avx512f(ZEXT416(1));
        uVar30 = 0;
        auVar48 = vpbroadcastq_avx512f();
        do {
          auVar49 = vpbroadcastq_avx512f();
          auVar50 = vmovdqa64_avx512f(auVar45);
          auVar45 = vporq_avx512f(auVar49,auVar46);
          auVar49 = vporq_avx512f(auVar49,auVar47);
          uVar17 = vpcmpuq_avx512f(auVar49,auVar48,2);
          bVar15 = (byte)uVar17;
          uVar17 = vpcmpuq_avx512f(auVar45,auVar48,2);
          bVar22 = (byte)uVar17;
          uVar39 = CONCAT11(bVar22,bVar15);
          auVar45 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)pSVar4[(long)p_Var27].h.d.d + uVar30 * 4));
          auVar51._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * auVar45._4_4_;
          auVar51._0_4_ = (uint)(bVar15 & 1) * auVar45._0_4_;
          auVar51._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * auVar45._8_4_;
          auVar51._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * auVar45._12_4_;
          auVar51._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * auVar45._16_4_;
          auVar51._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * auVar45._20_4_;
          auVar51._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * auVar45._24_4_;
          auVar51._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * auVar45._28_4_;
          auVar51._32_4_ = (uint)(bVar22 & 1) * auVar45._32_4_;
          auVar51._36_4_ = (uint)(bVar22 >> 1 & 1) * auVar45._36_4_;
          auVar51._40_4_ = (uint)(bVar22 >> 2 & 1) * auVar45._40_4_;
          auVar51._44_4_ = (uint)(bVar22 >> 3 & 1) * auVar45._44_4_;
          auVar51._48_4_ = (uint)(bVar22 >> 4 & 1) * auVar45._48_4_;
          auVar51._52_4_ = (uint)(bVar22 >> 5 & 1) * auVar45._52_4_;
          auVar51._56_4_ = (uint)(bVar22 >> 6 & 1) * auVar45._56_4_;
          auVar51._60_4_ = (uint)(bVar22 >> 7) * auVar45._60_4_;
          uVar30 = uVar30 + 0x10;
          auVar45 = vpmulld_avx512f(auVar51,auVar50);
        } while ((uVar29 + 0xf & 0x1fffffff0) != uVar30);
        auVar48 = vmovdqa32_avx512f(auVar45);
        auVar45._0_4_ =
             (uint)(bVar15 & 1) * auVar48._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar50._0_4_;
        bVar14 = (bool)((byte)(uVar39 >> 1) & 1);
        auVar45._4_4_ = (uint)bVar14 * auVar48._4_4_ | (uint)!bVar14 * auVar50._4_4_;
        bVar14 = (bool)((byte)(uVar39 >> 2) & 1);
        auVar45._8_4_ = (uint)bVar14 * auVar48._8_4_ | (uint)!bVar14 * auVar50._8_4_;
        bVar14 = (bool)((byte)(uVar39 >> 3) & 1);
        auVar45._12_4_ = (uint)bVar14 * auVar48._12_4_ | (uint)!bVar14 * auVar50._12_4_;
        bVar14 = (bool)((byte)(uVar39 >> 4) & 1);
        auVar45._16_4_ = (uint)bVar14 * auVar48._16_4_ | (uint)!bVar14 * auVar50._16_4_;
        bVar14 = (bool)((byte)(uVar39 >> 5) & 1);
        auVar45._20_4_ = (uint)bVar14 * auVar48._20_4_ | (uint)!bVar14 * auVar50._20_4_;
        bVar14 = (bool)((byte)(uVar39 >> 6) & 1);
        auVar45._24_4_ = (uint)bVar14 * auVar48._24_4_ | (uint)!bVar14 * auVar50._24_4_;
        bVar14 = (bool)((byte)(uVar39 >> 7) & 1);
        auVar45._28_4_ = (uint)bVar14 * auVar48._28_4_ | (uint)!bVar14 * auVar50._28_4_;
        auVar45._32_4_ =
             (uint)(bVar22 & 1) * auVar48._32_4_ | (uint)!(bool)(bVar22 & 1) * auVar50._32_4_;
        bVar14 = (bool)(bVar22 >> 1 & 1);
        auVar45._36_4_ = (uint)bVar14 * auVar48._36_4_ | (uint)!bVar14 * auVar50._36_4_;
        bVar14 = (bool)(bVar22 >> 2 & 1);
        auVar45._40_4_ = (uint)bVar14 * auVar48._40_4_ | (uint)!bVar14 * auVar50._40_4_;
        bVar14 = (bool)(bVar22 >> 3 & 1);
        auVar45._44_4_ = (uint)bVar14 * auVar48._44_4_ | (uint)!bVar14 * auVar50._44_4_;
        bVar14 = (bool)(bVar22 >> 4 & 1);
        auVar45._48_4_ = (uint)bVar14 * auVar48._48_4_ | (uint)!bVar14 * auVar50._48_4_;
        bVar14 = (bool)(bVar22 >> 5 & 1);
        auVar45._52_4_ = (uint)bVar14 * auVar48._52_4_ | (uint)!bVar14 * auVar50._52_4_;
        bVar14 = (bool)(bVar22 >> 6 & 1);
        auVar45._56_4_ = (uint)bVar14 * auVar48._56_4_ | (uint)!bVar14 * auVar50._56_4_;
        auVar45._60_4_ =
             (uint)(bVar22 >> 7) * auVar48._60_4_ | (uint)!(bool)(bVar22 >> 7) * auVar50._60_4_;
        auVar44 = vextracti64x4_avx512f(auVar45,1);
        auVar45 = vpmulld_avx512f(auVar45,ZEXT3264(auVar44));
        auVar41 = vpmulld_avx(auVar45._0_16_,auVar45._16_16_);
        auVar40 = vpshufd_avx(auVar41,0xee);
        auVar41 = vpmulld_avx(auVar41,auVar40);
        auVar40 = vpshufd_avx(auVar41,0x55);
        auVar41 = vpmulld_avx(auVar41,auVar40);
        iVar68 = auVar41._0_4_;
      }
      iVar70 = 1;
      iVar69 = 1;
      pSVar6 = (this->v).
               super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar29 = (ulong)pSVar6[(long)p_Var27].h.d.nd;
      if (uVar29 != 0) {
        auVar45 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar48 = vpbroadcastq_avx512f();
        uVar30 = 0;
        do {
          auVar49 = vpbroadcastq_avx512f();
          auVar50 = vmovdqa64_avx512f(auVar45);
          auVar45 = vporq_avx512f(auVar49,auVar46);
          auVar49 = vporq_avx512f(auVar49,auVar47);
          uVar17 = vpcmpuq_avx512f(auVar49,auVar48,2);
          bVar15 = (byte)uVar17;
          uVar17 = vpcmpuq_avx512f(auVar45,auVar48,2);
          bVar22 = (byte)uVar17;
          uVar39 = CONCAT11(bVar22,bVar15);
          auVar45 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)pSVar6[(long)p_Var27].h.d.d + uVar30 * 4));
          auVar52._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * auVar45._4_4_;
          auVar52._0_4_ = (uint)(bVar15 & 1) * auVar45._0_4_;
          auVar52._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * auVar45._8_4_;
          auVar52._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * auVar45._12_4_;
          auVar52._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * auVar45._16_4_;
          auVar52._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * auVar45._20_4_;
          auVar52._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * auVar45._24_4_;
          auVar52._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * auVar45._28_4_;
          auVar52._32_4_ = (uint)(bVar22 & 1) * auVar45._32_4_;
          auVar52._36_4_ = (uint)(bVar22 >> 1 & 1) * auVar45._36_4_;
          auVar52._40_4_ = (uint)(bVar22 >> 2 & 1) * auVar45._40_4_;
          auVar52._44_4_ = (uint)(bVar22 >> 3 & 1) * auVar45._44_4_;
          auVar52._48_4_ = (uint)(bVar22 >> 4 & 1) * auVar45._48_4_;
          auVar52._52_4_ = (uint)(bVar22 >> 5 & 1) * auVar45._52_4_;
          auVar52._56_4_ = (uint)(bVar22 >> 6 & 1) * auVar45._56_4_;
          auVar52._60_4_ = (uint)(bVar22 >> 7) * auVar45._60_4_;
          uVar30 = uVar30 + 0x10;
          auVar45 = vpmulld_avx512f(auVar52,auVar50);
        } while ((uVar29 + 0xf & 0x1fffffff0) != uVar30);
        auVar45 = vmovdqa32_avx512f(auVar45);
        auVar53._0_4_ =
             (uint)(bVar15 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar50._0_4_;
        bVar14 = (bool)((byte)(uVar39 >> 1) & 1);
        auVar53._4_4_ = (uint)bVar14 * auVar45._4_4_ | (uint)!bVar14 * auVar50._4_4_;
        bVar14 = (bool)((byte)(uVar39 >> 2) & 1);
        auVar53._8_4_ = (uint)bVar14 * auVar45._8_4_ | (uint)!bVar14 * auVar50._8_4_;
        bVar14 = (bool)((byte)(uVar39 >> 3) & 1);
        auVar53._12_4_ = (uint)bVar14 * auVar45._12_4_ | (uint)!bVar14 * auVar50._12_4_;
        bVar14 = (bool)((byte)(uVar39 >> 4) & 1);
        auVar53._16_4_ = (uint)bVar14 * auVar45._16_4_ | (uint)!bVar14 * auVar50._16_4_;
        bVar14 = (bool)((byte)(uVar39 >> 5) & 1);
        auVar53._20_4_ = (uint)bVar14 * auVar45._20_4_ | (uint)!bVar14 * auVar50._20_4_;
        bVar14 = (bool)((byte)(uVar39 >> 6) & 1);
        auVar53._24_4_ = (uint)bVar14 * auVar45._24_4_ | (uint)!bVar14 * auVar50._24_4_;
        bVar14 = (bool)((byte)(uVar39 >> 7) & 1);
        auVar53._28_4_ = (uint)bVar14 * auVar45._28_4_ | (uint)!bVar14 * auVar50._28_4_;
        auVar53._32_4_ =
             (uint)(bVar22 & 1) * auVar45._32_4_ | (uint)!(bool)(bVar22 & 1) * auVar50._32_4_;
        bVar14 = (bool)(bVar22 >> 1 & 1);
        auVar53._36_4_ = (uint)bVar14 * auVar45._36_4_ | (uint)!bVar14 * auVar50._36_4_;
        bVar14 = (bool)(bVar22 >> 2 & 1);
        auVar53._40_4_ = (uint)bVar14 * auVar45._40_4_ | (uint)!bVar14 * auVar50._40_4_;
        bVar14 = (bool)(bVar22 >> 3 & 1);
        auVar53._44_4_ = (uint)bVar14 * auVar45._44_4_ | (uint)!bVar14 * auVar50._44_4_;
        bVar14 = (bool)(bVar22 >> 4 & 1);
        auVar53._48_4_ = (uint)bVar14 * auVar45._48_4_ | (uint)!bVar14 * auVar50._48_4_;
        bVar14 = (bool)(bVar22 >> 5 & 1);
        auVar53._52_4_ = (uint)bVar14 * auVar45._52_4_ | (uint)!bVar14 * auVar50._52_4_;
        bVar14 = (bool)(bVar22 >> 6 & 1);
        auVar53._56_4_ = (uint)bVar14 * auVar45._56_4_ | (uint)!bVar14 * auVar50._56_4_;
        auVar53._60_4_ =
             (uint)(bVar22 >> 7) * auVar45._60_4_ | (uint)!(bool)(bVar22 >> 7) * auVar50._60_4_;
        auVar44 = vextracti64x4_avx512f(auVar53,1);
        auVar45 = vpmulld_avx512f(auVar53,ZEXT3264(auVar44));
        auVar41 = vpmulld_avx(auVar45._0_16_,auVar45._16_16_);
        auVar40 = vpshufd_avx(auVar41,0xee);
        auVar41 = vpmulld_avx(auVar41,auVar40);
        auVar40 = vpshufd_avx(auVar41,0x55);
        auVar41 = vpmulld_avx(auVar41,auVar40);
        iVar69 = auVar41._0_4_;
      }
      uVar36 = iVar69 * pSVar6[(long)p_Var27].h.d.bd;
      uVar29 = (ulong)(pPVar5->values).d.nd;
      if (uVar29 != 0) {
        auVar45 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar48 = vpbroadcastq_avx512f();
        uVar30 = 0;
        do {
          auVar49 = vpbroadcastq_avx512f();
          auVar50 = vmovdqa64_avx512f(auVar45);
          auVar45 = vporq_avx512f(auVar49,auVar46);
          auVar49 = vporq_avx512f(auVar49,auVar47);
          uVar17 = vpcmpuq_avx512f(auVar49,auVar48,2);
          bVar15 = (byte)uVar17;
          uVar17 = vpcmpuq_avx512f(auVar45,auVar48,2);
          bVar22 = (byte)uVar17;
          uVar39 = CONCAT11(bVar22,bVar15);
          auVar45 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pPVar5->values).d.d + uVar30));
          auVar54._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * auVar45._4_4_;
          auVar54._0_4_ = (uint)(bVar15 & 1) * auVar45._0_4_;
          auVar54._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * auVar45._8_4_;
          auVar54._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * auVar45._12_4_;
          auVar54._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * auVar45._16_4_;
          auVar54._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * auVar45._20_4_;
          auVar54._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * auVar45._24_4_;
          auVar54._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * auVar45._28_4_;
          auVar54._32_4_ = (uint)(bVar22 & 1) * auVar45._32_4_;
          auVar54._36_4_ = (uint)(bVar22 >> 1 & 1) * auVar45._36_4_;
          auVar54._40_4_ = (uint)(bVar22 >> 2 & 1) * auVar45._40_4_;
          auVar54._44_4_ = (uint)(bVar22 >> 3 & 1) * auVar45._44_4_;
          auVar54._48_4_ = (uint)(bVar22 >> 4 & 1) * auVar45._48_4_;
          auVar54._52_4_ = (uint)(bVar22 >> 5 & 1) * auVar45._52_4_;
          auVar54._56_4_ = (uint)(bVar22 >> 6 & 1) * auVar45._56_4_;
          auVar54._60_4_ = (uint)(bVar22 >> 7) * auVar45._60_4_;
          uVar30 = uVar30 + 0x10;
          auVar45 = vpmulld_avx512f(auVar54,auVar50);
        } while ((uVar29 + 0xf & 0x1fffffff0) != uVar30);
        auVar45 = vmovdqa32_avx512f(auVar45);
        auVar46._0_4_ =
             (uint)(bVar15 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar50._0_4_;
        bVar14 = (bool)((byte)(uVar39 >> 1) & 1);
        auVar46._4_4_ = (uint)bVar14 * auVar45._4_4_ | (uint)!bVar14 * auVar50._4_4_;
        bVar14 = (bool)((byte)(uVar39 >> 2) & 1);
        auVar46._8_4_ = (uint)bVar14 * auVar45._8_4_ | (uint)!bVar14 * auVar50._8_4_;
        bVar14 = (bool)((byte)(uVar39 >> 3) & 1);
        auVar46._12_4_ = (uint)bVar14 * auVar45._12_4_ | (uint)!bVar14 * auVar50._12_4_;
        bVar14 = (bool)((byte)(uVar39 >> 4) & 1);
        auVar46._16_4_ = (uint)bVar14 * auVar45._16_4_ | (uint)!bVar14 * auVar50._16_4_;
        bVar14 = (bool)((byte)(uVar39 >> 5) & 1);
        auVar46._20_4_ = (uint)bVar14 * auVar45._20_4_ | (uint)!bVar14 * auVar50._20_4_;
        bVar14 = (bool)((byte)(uVar39 >> 6) & 1);
        auVar46._24_4_ = (uint)bVar14 * auVar45._24_4_ | (uint)!bVar14 * auVar50._24_4_;
        bVar14 = (bool)((byte)(uVar39 >> 7) & 1);
        auVar46._28_4_ = (uint)bVar14 * auVar45._28_4_ | (uint)!bVar14 * auVar50._28_4_;
        auVar46._32_4_ =
             (uint)(bVar22 & 1) * auVar45._32_4_ | (uint)!(bool)(bVar22 & 1) * auVar50._32_4_;
        bVar14 = (bool)(bVar22 >> 1 & 1);
        auVar46._36_4_ = (uint)bVar14 * auVar45._36_4_ | (uint)!bVar14 * auVar50._36_4_;
        bVar14 = (bool)(bVar22 >> 2 & 1);
        auVar46._40_4_ = (uint)bVar14 * auVar45._40_4_ | (uint)!bVar14 * auVar50._40_4_;
        bVar14 = (bool)(bVar22 >> 3 & 1);
        auVar46._44_4_ = (uint)bVar14 * auVar45._44_4_ | (uint)!bVar14 * auVar50._44_4_;
        bVar14 = (bool)(bVar22 >> 4 & 1);
        auVar46._48_4_ = (uint)bVar14 * auVar45._48_4_ | (uint)!bVar14 * auVar50._48_4_;
        bVar14 = (bool)(bVar22 >> 5 & 1);
        auVar46._52_4_ = (uint)bVar14 * auVar45._52_4_ | (uint)!bVar14 * auVar50._52_4_;
        bVar14 = (bool)(bVar22 >> 6 & 1);
        auVar46._56_4_ = (uint)bVar14 * auVar45._56_4_ | (uint)!bVar14 * auVar50._56_4_;
        auVar46._60_4_ =
             (uint)(bVar22 >> 7) * auVar45._60_4_ | (uint)!(bool)(bVar22 >> 7) * auVar50._60_4_;
        auVar44 = vextracti64x4_avx512f(auVar46,1);
        auVar45 = vpmulld_avx512f(auVar46,ZEXT3264(auVar44));
        auVar41 = vpmulld_avx(auVar45._0_16_,auVar45._16_16_);
        auVar40 = vpshufd_avx(auVar41,0xee);
        auVar41 = vpmulld_avx(auVar41,auVar40);
        auVar40 = vpshufd_avx(auVar41,0x55);
        auVar41 = vpmulld_avx(auVar41,auVar40);
        iVar70 = auVar41._0_4_;
      }
      uVar38 = iVar67 * (pPVar5->g).d.bd;
      uVar29 = (ulong)uVar38;
      update::t = uVar24;
      local_150 = p_Var27;
      if (iVar68 * pSVar4[(long)p_Var27].h.d.bd != uVar38) goto LAB_00281290;
      pfVar7 = pSVar4[(long)p_Var27].h.v;
      pTVar8 = (pointer)pSVar6[(long)p_Var27].h.v;
      rVar2 = (this->super_Trainer).lambda;
      fVar1 = this->beta_1;
      pfVar9 = (pPVar5->g).v;
      pfVar10 = (pPVar5->values).v;
      uVar3 = (pPVar5->values).d.bd;
      fStack_17c = SUB84(pfVar9,0);
      uStack_178 = (undefined4)((ulong)pfVar9 >> 0x20);
      local_148.
      super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_148.
                             super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,fVar1);
      local_148.
      super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
      _M_impl.super__Vector_impl_data._M_finish._4_4_ = SUB84(pfVar7,0);
      local_148.
      super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)((ulong)pfVar7 >> 0x20);
      uVar30 = uVar29;
      if ((((ulong)pfVar7 & 3) == 0) &&
         (uVar30 = (ulong)(-((uint)((ulong)pfVar7 >> 2) & 0x3fffffff) & 0xf), uVar29 <= uVar30)) {
        uVar30 = uVar29;
      }
      uVar31 = uVar29 - uVar30;
      uVar28 = uVar31 + 0xf;
      if (-1 < (long)uVar31) {
        uVar28 = uVar31;
      }
      auVar41 = ZEXT416((uint)((1.0 - fVar1) * fVar72));
      if (uVar30 != 0) {
        uVar34 = 0;
        do {
          auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * pfVar7[uVar34])),auVar41,
                                    ZEXT416((uint)pfVar9[uVar34]));
          pfVar7[uVar34] = auVar40._0_4_;
          uVar34 = uVar34 + 1;
        } while (uVar30 != uVar34);
      }
      uVar28 = (uVar28 & 0xfffffffffffffff0) + uVar30;
      if (0xf < (long)uVar31) {
        auVar40._0_4_ = (1.0 - fVar1) * fVar72;
        auVar40._4_4_ = fStack_184 * 0.0;
        auVar40._8_4_ = fStack_180 * 0.0;
        auVar40._12_4_ = fStack_17c * 0.0;
        auVar45 = vbroadcastss_avx512f(ZEXT416((uint)fVar1));
        auVar46 = vbroadcastss_avx512f(auVar40);
        do {
          auVar47 = vmulps_avx512f(auVar45,*(undefined1 (*) [64])(pfVar7 + uVar30));
          auVar47 = vfmadd231ps_avx512f(auVar47,auVar46,*(undefined1 (*) [64])(pfVar9 + uVar30));
          *(undefined1 (*) [64])(pfVar7 + uVar30) = auVar47;
          uVar30 = uVar30 + 0x10;
        } while ((long)uVar30 < (long)uVar28);
      }
      if ((long)uVar28 < (long)uVar29) {
        do {
          auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * pfVar7[uVar28])),auVar41,
                                    ZEXT416((uint)pfVar9[uVar28]));
          pfVar7[uVar28] = auVar40._0_4_;
          uVar28 = uVar28 + 1;
        } while (uVar29 != uVar28);
      }
      local_188 = fVar72;
      if (uVar36 != uVar38) goto LAB_00281279;
      fVar1 = this->beta_2;
      local_148.
      super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_148.
                             super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,fVar1);
      local_148.
      super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
      _M_impl.super__Vector_impl_data._M_finish._4_4_ = SUB84(pTVar8,0);
      local_148.
      super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)((ulong)pTVar8 >> 0x20);
      uVar30 = uVar29;
      if ((((ulong)pTVar8 & 3) == 0) &&
         (uVar30 = (ulong)(-((uint)((ulong)pTVar8 >> 2) & 0x3fffffff) & 0xf), uVar29 <= uVar30)) {
        uVar30 = uVar29;
      }
      auVar45 = vmovdqu64_avx512f(local_78);
      uVar31 = uVar29 - uVar30;
      uVar28 = uVar31 + 0xf;
      if (-1 < (long)uVar31) {
        uVar28 = uVar31;
      }
      fVar16 = (1.0 - fVar1) * local_160._0_4_;
      auVar45 = vpermt2d_avx512f(ZEXT3264(CONCAT1616(CONCAT412(fVar72,CONCAT48(fVar72,CONCAT44(
                                                  fVar72,fVar72))),ZEXT416((uint)(1.0 - fVar1)))),
                                 auVar45,ZEXT864(pfVar9));
      auVar46 = valignd_avx512f(auVar45,auVar45,9);
      if (uVar30 != 0) {
        uVar34 = 0;
        do {
          auVar41 = vfmadd132ss_fma(ZEXT416((uint)(fVar16 * *(float *)(auVar46._0_8_ + uVar34 * 4)))
                                    ,ZEXT416((uint)(fVar1 * (float)(pTVar8->d).d[uVar34])),
                                    ZEXT416((uint)pfVar9[uVar34]));
          (pTVar8->d).d[uVar34] = auVar41._0_4_;
          uVar34 = uVar34 + 1;
        } while (uVar30 != uVar34);
      }
      uVar28 = (uVar28 & 0xfffffffffffffff0) + uVar30;
      if (0xf < (long)uVar31) {
        auVar47 = vpmovsxbd_avx512f(_DAT_002e6de0);
        auVar45 = vpermt2d_avx512f(auVar45,auVar47,ZEXT464(uVar38));
        auVar47 = vbroadcastss_avx512f(ZEXT416((uint)fVar1));
        auVar40 = vextracti32x4_avx512f(auVar45,2);
        lVar32 = vpextrq_avx(auVar40,1);
        auVar41 = vpshufd_avx(auVar45._16_16_,0xee);
        auVar45 = vbroadcastss_avx512f(ZEXT416((uint)(auVar41._0_4_ * auVar45._0_4_ * fVar72)));
        do {
          auVar48 = vmulps_avx512f(auVar47,*(undefined1 (*) [64])((pTVar8->d).d + uVar30));
          auVar49 = vmulps_avx512f(auVar45,*(undefined1 (*) [64])
                                            ((lVar32 << 0x20 | auVar40._0_8_ >> 0x20) + uVar30 * 4))
          ;
          auVar48 = vfmadd132ps_avx512f(auVar49,auVar48,*(undefined1 (*) [64])(pfVar9 + uVar30));
          *(undefined1 (*) [64])((pTVar8->d).d + uVar30) = auVar48;
          uVar30 = uVar30 + 0x10;
        } while ((long)uVar30 < (long)uVar28);
      }
      local_d8 = ZEXT416((uint)rVar2);
      local_e8._0_8_ = pSVar37;
      if ((long)uVar28 < (long)uVar29) {
        do {
          auVar41 = vfmadd132ss_fma(ZEXT416((uint)(fVar16 * *(float *)(auVar46._0_8_ + uVar28 * 4)))
                                    ,ZEXT416((uint)(fVar1 * (float)(pTVar8->d).d[uVar28])),
                                    ZEXT416((uint)pfVar9[uVar28]));
          (pTVar8->d).d[uVar28] = auVar41._0_4_;
          uVar28 = uVar28 + 1;
        } while (uVar29 != uVar28);
      }
      auVar40 = in_ZMM8._0_16_;
      auVar41 = vcvtusi2sd_avx512f(auVar40,uVar24);
      local_170 = auVar41._0_8_;
      dVar71 = pow((double)this->beta_1,local_170);
      local_f8._0_8_ = dVar71;
      dVar71 = pow((double)this->beta_2,local_170);
      if (uVar38 - iVar70 * uVar3 != 0) goto LAB_002812a7;
      auVar45 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
      auVar46 = vbroadcastss_avx512f(ZEXT416(0x3fc00000));
      auVar47 = vpbroadcastd_avx512f(ZEXT416(0x7fffffff));
      in_ZMM17 = vpbroadcastd_avx512f(ZEXT416(0x7fffff));
      auVar48 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar49 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar17 = local_e8._0_8_;
      in_ZMM16 = vpternlogd_avx512f(in_ZMM16,in_ZMM16,in_ZMM16,0xff);
      uVar29 = (ulong)(pPVar5->values).d.nd;
      if (uVar29 == 0) {
        iVar68 = 1;
      }
      else {
        auVar50 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar51 = vpbroadcastq_avx512f();
        uVar30 = 0;
        do {
          auVar52 = vpbroadcastq_avx512f();
          auVar53 = vmovdqa64_avx512f(auVar50);
          auVar50 = vporq_avx512f(auVar52,auVar48);
          auVar52 = vporq_avx512f(auVar52,auVar49);
          uVar18 = vpcmpuq_avx512f(auVar52,auVar51,2);
          bVar15 = (byte)uVar18;
          uVar18 = vpcmpuq_avx512f(auVar50,auVar51,2);
          bVar22 = (byte)uVar18;
          uVar39 = CONCAT11(bVar22,bVar15);
          auVar52 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pPVar5->values).d.d + uVar30));
          auVar50._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * auVar52._4_4_;
          auVar50._0_4_ = (uint)(bVar15 & 1) * auVar52._0_4_;
          auVar50._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * auVar52._8_4_;
          auVar50._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * auVar52._12_4_;
          auVar50._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * auVar52._16_4_;
          auVar50._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * auVar52._20_4_;
          auVar50._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * auVar52._24_4_;
          auVar50._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * auVar52._28_4_;
          auVar50._32_4_ = (uint)(bVar22 & 1) * auVar52._32_4_;
          auVar50._36_4_ = (uint)(bVar22 >> 1 & 1) * auVar52._36_4_;
          auVar50._40_4_ = (uint)(bVar22 >> 2 & 1) * auVar52._40_4_;
          auVar50._44_4_ = (uint)(bVar22 >> 3 & 1) * auVar52._44_4_;
          auVar50._48_4_ = (uint)(bVar22 >> 4 & 1) * auVar52._48_4_;
          auVar50._52_4_ = (uint)(bVar22 >> 5 & 1) * auVar52._52_4_;
          auVar50._56_4_ = (uint)(bVar22 >> 6 & 1) * auVar52._56_4_;
          auVar50._60_4_ = (uint)(bVar22 >> 7) * auVar52._60_4_;
          uVar30 = uVar30 + 0x10;
          auVar50 = vpmulld_avx512f(auVar50,auVar53);
        } while ((uVar29 + 0xf & 0x1fffffff0) != uVar30);
        auVar48 = vmovdqa32_avx512f(auVar50);
        auVar55._0_4_ =
             (uint)(bVar15 & 1) * auVar48._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar53._0_4_;
        bVar14 = (bool)((byte)(uVar39 >> 1) & 1);
        auVar55._4_4_ = (uint)bVar14 * auVar48._4_4_ | (uint)!bVar14 * auVar53._4_4_;
        bVar14 = (bool)((byte)(uVar39 >> 2) & 1);
        auVar55._8_4_ = (uint)bVar14 * auVar48._8_4_ | (uint)!bVar14 * auVar53._8_4_;
        bVar14 = (bool)((byte)(uVar39 >> 3) & 1);
        auVar55._12_4_ = (uint)bVar14 * auVar48._12_4_ | (uint)!bVar14 * auVar53._12_4_;
        bVar14 = (bool)((byte)(uVar39 >> 4) & 1);
        auVar55._16_4_ = (uint)bVar14 * auVar48._16_4_ | (uint)!bVar14 * auVar53._16_4_;
        bVar14 = (bool)((byte)(uVar39 >> 5) & 1);
        auVar55._20_4_ = (uint)bVar14 * auVar48._20_4_ | (uint)!bVar14 * auVar53._20_4_;
        bVar14 = (bool)((byte)(uVar39 >> 6) & 1);
        auVar55._24_4_ = (uint)bVar14 * auVar48._24_4_ | (uint)!bVar14 * auVar53._24_4_;
        bVar14 = (bool)((byte)(uVar39 >> 7) & 1);
        auVar55._28_4_ = (uint)bVar14 * auVar48._28_4_ | (uint)!bVar14 * auVar53._28_4_;
        auVar55._32_4_ =
             (uint)(bVar22 & 1) * auVar48._32_4_ | (uint)!(bool)(bVar22 & 1) * auVar53._32_4_;
        bVar14 = (bool)(bVar22 >> 1 & 1);
        auVar55._36_4_ = (uint)bVar14 * auVar48._36_4_ | (uint)!bVar14 * auVar53._36_4_;
        bVar14 = (bool)(bVar22 >> 2 & 1);
        auVar55._40_4_ = (uint)bVar14 * auVar48._40_4_ | (uint)!bVar14 * auVar53._40_4_;
        bVar14 = (bool)(bVar22 >> 3 & 1);
        auVar55._44_4_ = (uint)bVar14 * auVar48._44_4_ | (uint)!bVar14 * auVar53._44_4_;
        bVar14 = (bool)(bVar22 >> 4 & 1);
        auVar55._48_4_ = (uint)bVar14 * auVar48._48_4_ | (uint)!bVar14 * auVar53._48_4_;
        bVar14 = (bool)(bVar22 >> 5 & 1);
        auVar55._52_4_ = (uint)bVar14 * auVar48._52_4_ | (uint)!bVar14 * auVar53._52_4_;
        bVar14 = (bool)(bVar22 >> 6 & 1);
        auVar55._56_4_ = (uint)bVar14 * auVar48._56_4_ | (uint)!bVar14 * auVar53._56_4_;
        auVar55._60_4_ =
             (uint)(bVar22 >> 7) * auVar48._60_4_ | (uint)!(bool)(bVar22 >> 7) * auVar53._60_4_;
        auVar44 = vextracti64x4_avx512f(auVar55,1);
        auVar48 = vpmulld_avx512f(auVar55,ZEXT3264(auVar44));
        auVar41 = vpmulld_avx(auVar48._0_16_,auVar48._16_16_);
        auVar43 = vpshufd_avx(auVar41,0xee);
        auVar41 = vpmulld_avx(auVar41,auVar43);
        auVar43 = vpshufd_avx(auVar41,0x55);
        auVar41 = vpmulld_avx(auVar41,auVar43);
        iVar68 = auVar41._0_4_;
      }
      uVar24 = iVar68 * (pPVar5->values).d.bd;
      uVar29 = (ulong)uVar24;
      pfVar9 = (pPVar5->values).v;
      fVar72 = (float)(1.0 - (double)local_f8._0_8_);
      local_110 = (float)(1.0 - dVar71);
      local_108 = this->eps;
      local_148.
      super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_148.
                             super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,fVar72);
      local_128 = pTVar8;
      local_118 = (double)(ulong)uVar36;
      if (uVar24 != uVar38) {
LAB_00281257:
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                     );
      }
      uVar30 = uVar29;
      if ((((ulong)pfVar9 & 3) == 0) &&
         (uVar30 = (ulong)(-((uint)((ulong)pfVar9 >> 2) & 0x3fffffff) & 0xf), uVar29 <= uVar30)) {
        uVar30 = uVar29;
      }
      auVar41._8_4_ = 0x80000000;
      auVar41._0_8_ = 0x8000000080000000;
      auVar41._12_4_ = 0x80000000;
      auVar41 = vxorps_avx512vl(ZEXT416((uint)(this->super_Trainer).eta),auVar41);
      uVar31 = uVar29 - uVar30;
      uVar28 = uVar31 + 0xf;
      if (-1 < (long)uVar31) {
        uVar28 = uVar31;
      }
      if (uVar30 != 0) {
        uVar34 = 0;
        do {
          auVar42 = vfnmadd213ss_avx512f
                              (ZEXT416((uint)pfVar10[uVar34]),local_d8,ZEXT416((uint)pfVar9[uVar34])
                              );
          auVar43 = ZEXT416((uint)((1.0 / local_110) * (float)(pTVar8->d).d[uVar34]));
          auVar43 = vsqrtss_avx(auVar43,auVar43);
          pfVar9[uVar34] =
               (auVar41._0_4_ * pfVar7[uVar34]) / ((auVar43._0_4_ + local_108) * fVar72) +
               auVar42._0_4_;
          uVar34 = uVar34 + 1;
        } while (uVar30 != uVar34);
      }
      uVar28 = (uVar28 & 0xfffffffffffffff0) + uVar30;
      if (0xf < (long)uVar31) {
        auVar43._8_4_ = 0x80000000;
        auVar43._0_8_ = 0x8000000080000000;
        auVar43._12_4_ = 0x80000000;
        auVar40 = vxorps_avx512vl(local_d8,auVar43);
        auVar48 = vbroadcastss_avx512f(ZEXT416((uint)fVar72));
        auVar49 = vbroadcastss_avx512f(ZEXT416((uint)local_108));
        auVar50 = vbroadcastss_avx512f(auVar41);
        auVar42._0_4_ = 1.0 / local_110;
        auVar42._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar51 = vbroadcastss_avx512f(auVar40);
        auVar52 = vbroadcastss_avx512f(auVar42);
        auVar40 = auVar52._0_16_;
        do {
          auVar53 = vmulps_avx512f(auVar52,*(undefined1 (*) [64])((pTVar8->d).d + uVar30));
          auVar54 = vmulps_avx512f(auVar50,*(undefined1 (*) [64])(pfVar7 + uVar30));
          auVar55 = vrsqrt14ps_avx512f(auVar53);
          auVar56 = vmulps_avx512f(auVar53,auVar45);
          auVar57 = vpaddd_avx512f(auVar53,in_ZMM16);
          uVar19 = vptestnmd_avx512f(auVar53,auVar47);
          uVar18 = vpcmpud_avx512f(auVar57,in_ZMM17,1);
          uVar39 = (ushort)uVar19 | (ushort)uVar18;
          auVar57 = vmulps_avx512f(auVar55,auVar55);
          auVar53 = vmulps_avx512f(auVar53,auVar55);
          auVar55 = vfmadd213ps_avx512f(auVar57,auVar56,auVar46);
          auVar53 = vfmadd213ps_avx512f(auVar53,auVar55,auVar49);
          bVar14 = (bool)((byte)uVar39 & 1);
          auVar56._0_4_ = (uint)bVar14 * auVar49._0_4_ | (uint)!bVar14 * auVar53._0_4_;
          bVar14 = (bool)((byte)(uVar39 >> 1) & 1);
          auVar56._4_4_ = (uint)bVar14 * auVar49._4_4_ | (uint)!bVar14 * auVar53._4_4_;
          bVar14 = (bool)((byte)(uVar39 >> 2) & 1);
          auVar56._8_4_ = (uint)bVar14 * auVar49._8_4_ | (uint)!bVar14 * auVar53._8_4_;
          bVar14 = (bool)((byte)(uVar39 >> 3) & 1);
          auVar56._12_4_ = (uint)bVar14 * auVar49._12_4_ | (uint)!bVar14 * auVar53._12_4_;
          bVar14 = (bool)((byte)(uVar39 >> 4) & 1);
          auVar56._16_4_ = (uint)bVar14 * auVar49._16_4_ | (uint)!bVar14 * auVar53._16_4_;
          bVar14 = (bool)((byte)(uVar39 >> 5) & 1);
          auVar56._20_4_ = (uint)bVar14 * auVar49._20_4_ | (uint)!bVar14 * auVar53._20_4_;
          bVar14 = (bool)((byte)(uVar39 >> 6) & 1);
          auVar56._24_4_ = (uint)bVar14 * auVar49._24_4_ | (uint)!bVar14 * auVar53._24_4_;
          bVar14 = (bool)((byte)(uVar39 >> 7) & 1);
          auVar56._28_4_ = (uint)bVar14 * auVar49._28_4_ | (uint)!bVar14 * auVar53._28_4_;
          bVar15 = (byte)(uVar39 >> 8);
          auVar56._32_4_ =
               (uint)(bVar15 & 1) * auVar49._32_4_ | (uint)!(bool)(bVar15 & 1) * auVar53._32_4_;
          bVar14 = (bool)(bVar15 >> 1 & 1);
          auVar56._36_4_ = (uint)bVar14 * auVar49._36_4_ | (uint)!bVar14 * auVar53._36_4_;
          bVar14 = (bool)(bVar15 >> 2 & 1);
          auVar56._40_4_ = (uint)bVar14 * auVar49._40_4_ | (uint)!bVar14 * auVar53._40_4_;
          bVar14 = (bool)(bVar15 >> 3 & 1);
          auVar56._44_4_ = (uint)bVar14 * auVar49._44_4_ | (uint)!bVar14 * auVar53._44_4_;
          bVar14 = (bool)(bVar15 >> 4 & 1);
          auVar56._48_4_ = (uint)bVar14 * auVar49._48_4_ | (uint)!bVar14 * auVar53._48_4_;
          bVar14 = (bool)(bVar15 >> 5 & 1);
          auVar56._52_4_ = (uint)bVar14 * auVar49._52_4_ | (uint)!bVar14 * auVar53._52_4_;
          bVar14 = (bool)(bVar15 >> 6 & 1);
          auVar56._56_4_ = (uint)bVar14 * auVar49._56_4_ | (uint)!bVar14 * auVar53._56_4_;
          auVar56._60_4_ =
               (uint)(bVar15 >> 7) * auVar49._60_4_ | (uint)!(bool)(bVar15 >> 7) * auVar53._60_4_;
          auVar53 = vmulps_avx512f(auVar56,auVar48);
          auVar55 = vrcp14ps_avx512f(auVar53);
          auVar56 = vmulps_avx512f(auVar54,auVar55);
          auVar53 = vfmsub213ps_avx512f(auVar53,auVar56,auVar54);
          auVar53 = vfnmadd213ps_avx512f(auVar53,auVar55,auVar56);
          auVar54 = vfmadd213ps_avx512f(*(undefined1 (*) [64])(pfVar10 + uVar30),auVar51,
                                        *(undefined1 (*) [64])(pfVar9 + uVar30));
          auVar53 = vaddps_avx512f(auVar54,auVar53);
          *(undefined1 (*) [64])(pfVar9 + uVar30) = auVar53;
          uVar30 = uVar30 + 0x10;
        } while ((long)uVar30 < (long)uVar28);
      }
      if ((long)uVar28 < (long)uVar29) {
        do {
          auVar42 = vfnmadd213ss_avx512f
                              (ZEXT416((uint)pfVar10[uVar28]),local_d8,ZEXT416((uint)pfVar9[uVar28])
                              );
          auVar43 = ZEXT416((uint)((1.0 / local_110) * (float)(pTVar8->d).d[uVar28]));
          auVar43 = vsqrtss_avx(auVar43,auVar43);
          pfVar9[uVar28] =
               (auVar41._0_4_ * pfVar7[uVar28]) / ((auVar43._0_4_ + local_108) * fVar72) +
               auVar42._0_4_;
          uVar28 = uVar28 + 1;
        } while (uVar29 != uVar28);
      }
      in_ZMM8 = ZEXT1664(auVar40);
      Parameters::clear(pPVar5);
      auVar46 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar47 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      pSVar37 = (pointer)(uVar17 + 8);
      p_Var27 = (_Hash_node_base *)(ulong)((int)local_150 + 1);
      fVar72 = (float)local_b8._0_4_;
    } while (pSVar37 != local_158);
    pMVar25 = (this->super_Trainer).model;
  }
  ppLVar26 = (pMVar25->lookup_params).
             super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_c0 = (pMVar25->lookup_params).
             super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar26 != local_c0) {
    fVar72 = local_168._0_4_ * scale;
    auVar45 = vbroadcasti64x4_avx512f(_DAT_002e6e00);
    auVar46 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar47 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar48 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    local_1a0 = 0;
    local_b8 = vmovdqu64_avx512f(auVar45);
    local_f8 = ZEXT416((uint)fVar72);
    local_78._0_4_ = fVar72 * fVar72;
    do {
      this_00 = *ppLVar26;
      p_Var27 = (this_00->non_zero_grads)._M_h._M_before_begin._M_nxt;
      local_168 = ppLVar26;
      if (p_Var27 != (_Hash_node_base *)0x0) {
        auVar41 = vcvtusi2sd_avx512f(in_XMM25,update::t);
        local_160 = (this->lm).
                    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                    ._M_impl.super__Vector_impl_data._M_start + local_1a0;
        local_158 = (this->lv).
                    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                    ._M_impl.super__Vector_impl_data._M_start + local_1a0;
        do {
          uVar29 = (ulong)*(uint *)&p_Var27[1]._M_nxt;
          iVar67 = 1;
          iVar68 = 1;
          lVar11 = *(long *)&(local_160->h).
                             super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl;
          lVar32 = lVar11 + uVar29 * 0x48;
          if ((ulong)*(uint *)(lVar32 + 0x1c) != 0) {
            auVar45 = vmovdqa64_avx512f(auVar46);
            auVar49 = vpbroadcastq_avx512f();
            uVar30 = 0;
            do {
              auVar50 = vpbroadcastq_avx512f();
              auVar51 = vmovdqa64_avx512f(auVar45);
              auVar45 = vporq_avx512f(auVar50,auVar47);
              auVar50 = vporq_avx512f(auVar50,auVar48);
              uVar17 = vpcmpuq_avx512f(auVar50,auVar49,2);
              bVar15 = (byte)uVar17;
              uVar17 = vpcmpuq_avx512f(auVar45,auVar49,2);
              bVar22 = (byte)uVar17;
              uVar39 = CONCAT11(bVar22,bVar15);
              auVar45 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar32 + uVar30 * 4));
              auVar57._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * auVar45._4_4_;
              auVar57._0_4_ = (uint)(bVar15 & 1) * auVar45._0_4_;
              auVar57._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * auVar45._8_4_;
              auVar57._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * auVar45._12_4_;
              auVar57._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * auVar45._16_4_;
              auVar57._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * auVar45._20_4_;
              auVar57._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * auVar45._24_4_;
              auVar57._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * auVar45._28_4_;
              auVar57._32_4_ = (uint)(bVar22 & 1) * auVar45._32_4_;
              auVar57._36_4_ = (uint)(bVar22 >> 1 & 1) * auVar45._36_4_;
              auVar57._40_4_ = (uint)(bVar22 >> 2 & 1) * auVar45._40_4_;
              auVar57._44_4_ = (uint)(bVar22 >> 3 & 1) * auVar45._44_4_;
              auVar57._48_4_ = (uint)(bVar22 >> 4 & 1) * auVar45._48_4_;
              auVar57._52_4_ = (uint)(bVar22 >> 5 & 1) * auVar45._52_4_;
              auVar57._56_4_ = (uint)(bVar22 >> 6 & 1) * auVar45._56_4_;
              auVar57._60_4_ = (uint)(bVar22 >> 7) * auVar45._60_4_;
              uVar30 = uVar30 + 0x10;
              auVar45 = vpmulld_avx512f(auVar57,auVar51);
            } while (((ulong)*(uint *)(lVar32 + 0x1c) + 0xf & 0x1fffffff0) != uVar30);
            auVar45 = vmovdqa32_avx512f(auVar45);
            auVar62._0_4_ =
                 (uint)(bVar15 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar51._0_4_;
            bVar14 = (bool)((byte)(uVar39 >> 1) & 1);
            auVar62._4_4_ = (uint)bVar14 * auVar45._4_4_ | (uint)!bVar14 * auVar51._4_4_;
            bVar14 = (bool)((byte)(uVar39 >> 2) & 1);
            auVar62._8_4_ = (uint)bVar14 * auVar45._8_4_ | (uint)!bVar14 * auVar51._8_4_;
            bVar14 = (bool)((byte)(uVar39 >> 3) & 1);
            auVar62._12_4_ = (uint)bVar14 * auVar45._12_4_ | (uint)!bVar14 * auVar51._12_4_;
            bVar14 = (bool)((byte)(uVar39 >> 4) & 1);
            auVar62._16_4_ = (uint)bVar14 * auVar45._16_4_ | (uint)!bVar14 * auVar51._16_4_;
            bVar14 = (bool)((byte)(uVar39 >> 5) & 1);
            auVar62._20_4_ = (uint)bVar14 * auVar45._20_4_ | (uint)!bVar14 * auVar51._20_4_;
            bVar14 = (bool)((byte)(uVar39 >> 6) & 1);
            auVar62._24_4_ = (uint)bVar14 * auVar45._24_4_ | (uint)!bVar14 * auVar51._24_4_;
            bVar14 = (bool)((byte)(uVar39 >> 7) & 1);
            auVar62._28_4_ = (uint)bVar14 * auVar45._28_4_ | (uint)!bVar14 * auVar51._28_4_;
            auVar62._32_4_ =
                 (uint)(bVar22 & 1) * auVar45._32_4_ | (uint)!(bool)(bVar22 & 1) * auVar51._32_4_;
            bVar14 = (bool)(bVar22 >> 1 & 1);
            auVar62._36_4_ = (uint)bVar14 * auVar45._36_4_ | (uint)!bVar14 * auVar51._36_4_;
            bVar14 = (bool)(bVar22 >> 2 & 1);
            auVar62._40_4_ = (uint)bVar14 * auVar45._40_4_ | (uint)!bVar14 * auVar51._40_4_;
            bVar14 = (bool)(bVar22 >> 3 & 1);
            auVar62._44_4_ = (uint)bVar14 * auVar45._44_4_ | (uint)!bVar14 * auVar51._44_4_;
            bVar14 = (bool)(bVar22 >> 4 & 1);
            auVar62._48_4_ = (uint)bVar14 * auVar45._48_4_ | (uint)!bVar14 * auVar51._48_4_;
            bVar14 = (bool)(bVar22 >> 5 & 1);
            auVar62._52_4_ = (uint)bVar14 * auVar45._52_4_ | (uint)!bVar14 * auVar51._52_4_;
            bVar14 = (bool)(bVar22 >> 6 & 1);
            auVar62._56_4_ = (uint)bVar14 * auVar45._56_4_ | (uint)!bVar14 * auVar51._56_4_;
            auVar62._60_4_ =
                 (uint)(bVar22 >> 7) * auVar45._60_4_ | (uint)!(bool)(bVar22 >> 7) * auVar51._60_4_;
            auVar44 = vextracti64x4_avx512f(auVar62,1);
            auVar45 = vpmulld_avx512f(auVar62,ZEXT3264(auVar44));
            auVar40 = vpmulld_avx(auVar45._0_16_,auVar45._16_16_);
            auVar43 = vpshufd_avx(auVar40,0xee);
            auVar40 = vpmulld_avx(auVar40,auVar43);
            auVar43 = vpshufd_avx(auVar40,0x55);
            auVar40 = vpmulld_avx(auVar40,auVar43);
            iVar68 = auVar40._0_4_;
          }
          pPVar5 = *(Parameters **)
                    &(local_158->h).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                     _M_impl;
          uVar30 = (ulong)(&pPVar5->dim)[uVar29 * 2].d[5];
          if (uVar30 != 0) {
            auVar45 = vmovdqa64_avx512f(auVar46);
            auVar49 = vpbroadcastq_avx512f();
            uVar28 = 0;
            do {
              auVar50 = vpbroadcastq_avx512f();
              auVar51 = vmovdqa64_avx512f(auVar45);
              auVar45 = vporq_avx512f(auVar50,auVar47);
              auVar50 = vporq_avx512f(auVar50,auVar48);
              uVar17 = vpcmpuq_avx512f(auVar50,auVar49,2);
              bVar15 = (byte)uVar17;
              uVar17 = vpcmpuq_avx512f(auVar45,auVar49,2);
              bVar22 = (byte)uVar17;
              uVar39 = CONCAT11(bVar22,bVar15);
              auVar45 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                           ((&pPVar5->dim)[uVar29 * 2].d + (uVar28 - 2)));
              auVar63._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * auVar45._4_4_;
              auVar63._0_4_ = (uint)(bVar15 & 1) * auVar45._0_4_;
              auVar63._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * auVar45._8_4_;
              auVar63._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * auVar45._12_4_;
              auVar63._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * auVar45._16_4_;
              auVar63._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * auVar45._20_4_;
              auVar63._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * auVar45._24_4_;
              auVar63._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * auVar45._28_4_;
              auVar63._32_4_ = (uint)(bVar22 & 1) * auVar45._32_4_;
              auVar63._36_4_ = (uint)(bVar22 >> 1 & 1) * auVar45._36_4_;
              auVar63._40_4_ = (uint)(bVar22 >> 2 & 1) * auVar45._40_4_;
              auVar63._44_4_ = (uint)(bVar22 >> 3 & 1) * auVar45._44_4_;
              auVar63._48_4_ = (uint)(bVar22 >> 4 & 1) * auVar45._48_4_;
              auVar63._52_4_ = (uint)(bVar22 >> 5 & 1) * auVar45._52_4_;
              auVar63._56_4_ = (uint)(bVar22 >> 6 & 1) * auVar45._56_4_;
              auVar63._60_4_ = (uint)(bVar22 >> 7) * auVar45._60_4_;
              uVar28 = uVar28 + 0x10;
              auVar45 = vpmulld_avx512f(auVar63,auVar51);
            } while ((uVar30 + 0xf & 0x1fffffff0) != uVar28);
            auVar45 = vmovdqa32_avx512f(auVar45);
            auVar64._0_4_ =
                 (uint)(bVar15 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar51._0_4_;
            bVar14 = (bool)((byte)(uVar39 >> 1) & 1);
            auVar64._4_4_ = (uint)bVar14 * auVar45._4_4_ | (uint)!bVar14 * auVar51._4_4_;
            bVar14 = (bool)((byte)(uVar39 >> 2) & 1);
            auVar64._8_4_ = (uint)bVar14 * auVar45._8_4_ | (uint)!bVar14 * auVar51._8_4_;
            bVar14 = (bool)((byte)(uVar39 >> 3) & 1);
            auVar64._12_4_ = (uint)bVar14 * auVar45._12_4_ | (uint)!bVar14 * auVar51._12_4_;
            bVar14 = (bool)((byte)(uVar39 >> 4) & 1);
            auVar64._16_4_ = (uint)bVar14 * auVar45._16_4_ | (uint)!bVar14 * auVar51._16_4_;
            bVar14 = (bool)((byte)(uVar39 >> 5) & 1);
            auVar64._20_4_ = (uint)bVar14 * auVar45._20_4_ | (uint)!bVar14 * auVar51._20_4_;
            bVar14 = (bool)((byte)(uVar39 >> 6) & 1);
            auVar64._24_4_ = (uint)bVar14 * auVar45._24_4_ | (uint)!bVar14 * auVar51._24_4_;
            bVar14 = (bool)((byte)(uVar39 >> 7) & 1);
            auVar64._28_4_ = (uint)bVar14 * auVar45._28_4_ | (uint)!bVar14 * auVar51._28_4_;
            auVar64._32_4_ =
                 (uint)(bVar22 & 1) * auVar45._32_4_ | (uint)!(bool)(bVar22 & 1) * auVar51._32_4_;
            bVar14 = (bool)(bVar22 >> 1 & 1);
            auVar64._36_4_ = (uint)bVar14 * auVar45._36_4_ | (uint)!bVar14 * auVar51._36_4_;
            bVar14 = (bool)(bVar22 >> 2 & 1);
            auVar64._40_4_ = (uint)bVar14 * auVar45._40_4_ | (uint)!bVar14 * auVar51._40_4_;
            bVar14 = (bool)(bVar22 >> 3 & 1);
            auVar64._44_4_ = (uint)bVar14 * auVar45._44_4_ | (uint)!bVar14 * auVar51._44_4_;
            bVar14 = (bool)(bVar22 >> 4 & 1);
            auVar64._48_4_ = (uint)bVar14 * auVar45._48_4_ | (uint)!bVar14 * auVar51._48_4_;
            bVar14 = (bool)(bVar22 >> 5 & 1);
            auVar64._52_4_ = (uint)bVar14 * auVar45._52_4_ | (uint)!bVar14 * auVar51._52_4_;
            bVar14 = (bool)(bVar22 >> 6 & 1);
            auVar64._56_4_ = (uint)bVar14 * auVar45._56_4_ | (uint)!bVar14 * auVar51._56_4_;
            auVar64._60_4_ =
                 (uint)(bVar22 >> 7) * auVar45._60_4_ | (uint)!(bool)(bVar22 >> 7) * auVar51._60_4_;
            auVar44 = vextracti64x4_avx512f(auVar64,1);
            auVar45 = vpmulld_avx512f(auVar64,ZEXT3264(auVar44));
            auVar40 = vpmulld_avx(auVar45._0_16_,auVar45._16_16_);
            auVar43 = vpshufd_avx(auVar40,0xee);
            auVar40 = vpmulld_avx(auVar40,auVar43);
            auVar43 = vpshufd_avx(auVar40,0x55);
            auVar40 = vpmulld_avx(auVar40,auVar43);
            iVar67 = auVar40._0_4_;
          }
          iVar69 = 1;
          pTVar8 = (this_00->grads).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          iVar70 = 1;
          uVar30 = (ulong)pTVar8[uVar29].d.nd;
          if (uVar30 != 0) {
            auVar45 = vmovdqa64_avx512f(auVar46);
            auVar49 = vpbroadcastq_avx512f();
            uVar28 = 0;
            do {
              auVar50 = vpbroadcastq_avx512f();
              auVar51 = vmovdqa64_avx512f(auVar45);
              auVar45 = vporq_avx512f(auVar50,auVar47);
              auVar50 = vporq_avx512f(auVar50,auVar48);
              uVar17 = vpcmpuq_avx512f(auVar50,auVar49,2);
              bVar15 = (byte)uVar17;
              uVar17 = vpcmpuq_avx512f(auVar45,auVar49,2);
              bVar22 = (byte)uVar17;
              uVar39 = CONCAT11(bVar22,bVar15);
              auVar45 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar8[uVar29].d.d + uVar28));
              auVar65._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * auVar45._4_4_;
              auVar65._0_4_ = (uint)(bVar15 & 1) * auVar45._0_4_;
              auVar65._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * auVar45._8_4_;
              auVar65._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * auVar45._12_4_;
              auVar65._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * auVar45._16_4_;
              auVar65._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * auVar45._20_4_;
              auVar65._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * auVar45._24_4_;
              auVar65._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * auVar45._28_4_;
              auVar65._32_4_ = (uint)(bVar22 & 1) * auVar45._32_4_;
              auVar65._36_4_ = (uint)(bVar22 >> 1 & 1) * auVar45._36_4_;
              auVar65._40_4_ = (uint)(bVar22 >> 2 & 1) * auVar45._40_4_;
              auVar65._44_4_ = (uint)(bVar22 >> 3 & 1) * auVar45._44_4_;
              auVar65._48_4_ = (uint)(bVar22 >> 4 & 1) * auVar45._48_4_;
              auVar65._52_4_ = (uint)(bVar22 >> 5 & 1) * auVar45._52_4_;
              auVar65._56_4_ = (uint)(bVar22 >> 6 & 1) * auVar45._56_4_;
              auVar65._60_4_ = (uint)(bVar22 >> 7) * auVar45._60_4_;
              uVar28 = uVar28 + 0x10;
              auVar45 = vpmulld_avx512f(auVar65,auVar51);
            } while ((uVar30 + 0xf & 0x1fffffff0) != uVar28);
            auVar45 = vmovdqa32_avx512f(auVar45);
            auVar58._0_4_ =
                 (uint)(bVar15 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar51._0_4_;
            bVar14 = (bool)((byte)(uVar39 >> 1) & 1);
            auVar58._4_4_ = (uint)bVar14 * auVar45._4_4_ | (uint)!bVar14 * auVar51._4_4_;
            bVar14 = (bool)((byte)(uVar39 >> 2) & 1);
            auVar58._8_4_ = (uint)bVar14 * auVar45._8_4_ | (uint)!bVar14 * auVar51._8_4_;
            bVar14 = (bool)((byte)(uVar39 >> 3) & 1);
            auVar58._12_4_ = (uint)bVar14 * auVar45._12_4_ | (uint)!bVar14 * auVar51._12_4_;
            bVar14 = (bool)((byte)(uVar39 >> 4) & 1);
            auVar58._16_4_ = (uint)bVar14 * auVar45._16_4_ | (uint)!bVar14 * auVar51._16_4_;
            bVar14 = (bool)((byte)(uVar39 >> 5) & 1);
            auVar58._20_4_ = (uint)bVar14 * auVar45._20_4_ | (uint)!bVar14 * auVar51._20_4_;
            bVar14 = (bool)((byte)(uVar39 >> 6) & 1);
            auVar58._24_4_ = (uint)bVar14 * auVar45._24_4_ | (uint)!bVar14 * auVar51._24_4_;
            bVar14 = (bool)((byte)(uVar39 >> 7) & 1);
            auVar58._28_4_ = (uint)bVar14 * auVar45._28_4_ | (uint)!bVar14 * auVar51._28_4_;
            auVar58._32_4_ =
                 (uint)(bVar22 & 1) * auVar45._32_4_ | (uint)!(bool)(bVar22 & 1) * auVar51._32_4_;
            bVar14 = (bool)(bVar22 >> 1 & 1);
            auVar58._36_4_ = (uint)bVar14 * auVar45._36_4_ | (uint)!bVar14 * auVar51._36_4_;
            bVar14 = (bool)(bVar22 >> 2 & 1);
            auVar58._40_4_ = (uint)bVar14 * auVar45._40_4_ | (uint)!bVar14 * auVar51._40_4_;
            bVar14 = (bool)(bVar22 >> 3 & 1);
            auVar58._44_4_ = (uint)bVar14 * auVar45._44_4_ | (uint)!bVar14 * auVar51._44_4_;
            bVar14 = (bool)(bVar22 >> 4 & 1);
            auVar58._48_4_ = (uint)bVar14 * auVar45._48_4_ | (uint)!bVar14 * auVar51._48_4_;
            bVar14 = (bool)(bVar22 >> 5 & 1);
            auVar58._52_4_ = (uint)bVar14 * auVar45._52_4_ | (uint)!bVar14 * auVar51._52_4_;
            bVar14 = (bool)(bVar22 >> 6 & 1);
            auVar58._56_4_ = (uint)bVar14 * auVar45._56_4_ | (uint)!bVar14 * auVar51._56_4_;
            auVar58._60_4_ =
                 (uint)(bVar22 >> 7) * auVar45._60_4_ | (uint)!(bool)(bVar22 >> 7) * auVar51._60_4_;
            auVar44 = vextracti64x4_avx512f(auVar58,1);
            auVar45 = vpmulld_avx512f(auVar58,ZEXT3264(auVar44));
            auVar40 = vpmulld_avx(auVar45._0_16_,auVar45._16_16_);
            auVar43 = vpshufd_avx(auVar40,0xee);
            auVar40 = vpmulld_avx(auVar40,auVar43);
            auVar43 = vpshufd_avx(auVar40,0x55);
            auVar40 = vpmulld_avx(auVar40,auVar43);
            iVar70 = auVar40._0_4_;
          }
          pTVar12 = (this_00->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar30 = (ulong)pTVar12[uVar29].d.nd;
          if (uVar30 != 0) {
            auVar45 = vmovdqa64_avx512f(auVar46);
            auVar46 = vpbroadcastq_avx512f();
            uVar28 = 0;
            do {
              auVar49 = vpbroadcastq_avx512f();
              auVar50 = vmovdqa64_avx512f(auVar45);
              auVar45 = vporq_avx512f(auVar49,auVar47);
              auVar49 = vporq_avx512f(auVar49,auVar48);
              uVar17 = vpcmpuq_avx512f(auVar49,auVar46,2);
              bVar15 = (byte)uVar17;
              uVar17 = vpcmpuq_avx512f(auVar45,auVar46,2);
              bVar22 = (byte)uVar17;
              uVar39 = CONCAT11(bVar22,bVar15);
              auVar45 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar12[uVar29].d.d + uVar28));
              auVar59._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * auVar45._4_4_;
              auVar59._0_4_ = (uint)(bVar15 & 1) * auVar45._0_4_;
              auVar59._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * auVar45._8_4_;
              auVar59._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * auVar45._12_4_;
              auVar59._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * auVar45._16_4_;
              auVar59._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * auVar45._20_4_;
              auVar59._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * auVar45._24_4_;
              auVar59._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * auVar45._28_4_;
              auVar59._32_4_ = (uint)(bVar22 & 1) * auVar45._32_4_;
              auVar59._36_4_ = (uint)(bVar22 >> 1 & 1) * auVar45._36_4_;
              auVar59._40_4_ = (uint)(bVar22 >> 2 & 1) * auVar45._40_4_;
              auVar59._44_4_ = (uint)(bVar22 >> 3 & 1) * auVar45._44_4_;
              auVar59._48_4_ = (uint)(bVar22 >> 4 & 1) * auVar45._48_4_;
              auVar59._52_4_ = (uint)(bVar22 >> 5 & 1) * auVar45._52_4_;
              auVar59._56_4_ = (uint)(bVar22 >> 6 & 1) * auVar45._56_4_;
              auVar59._60_4_ = (uint)(bVar22 >> 7) * auVar45._60_4_;
              uVar28 = uVar28 + 0x10;
              auVar45 = vpmulld_avx512f(auVar59,auVar50);
            } while ((uVar30 + 0xf & 0x1fffffff0) != uVar28);
            auVar45 = vmovdqa32_avx512f(auVar45);
            auVar47._0_4_ =
                 (uint)(bVar15 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar50._0_4_;
            bVar14 = (bool)((byte)(uVar39 >> 1) & 1);
            auVar47._4_4_ = (uint)bVar14 * auVar45._4_4_ | (uint)!bVar14 * auVar50._4_4_;
            bVar14 = (bool)((byte)(uVar39 >> 2) & 1);
            auVar47._8_4_ = (uint)bVar14 * auVar45._8_4_ | (uint)!bVar14 * auVar50._8_4_;
            bVar14 = (bool)((byte)(uVar39 >> 3) & 1);
            auVar47._12_4_ = (uint)bVar14 * auVar45._12_4_ | (uint)!bVar14 * auVar50._12_4_;
            bVar14 = (bool)((byte)(uVar39 >> 4) & 1);
            auVar47._16_4_ = (uint)bVar14 * auVar45._16_4_ | (uint)!bVar14 * auVar50._16_4_;
            bVar14 = (bool)((byte)(uVar39 >> 5) & 1);
            auVar47._20_4_ = (uint)bVar14 * auVar45._20_4_ | (uint)!bVar14 * auVar50._20_4_;
            bVar14 = (bool)((byte)(uVar39 >> 6) & 1);
            auVar47._24_4_ = (uint)bVar14 * auVar45._24_4_ | (uint)!bVar14 * auVar50._24_4_;
            bVar14 = (bool)((byte)(uVar39 >> 7) & 1);
            auVar47._28_4_ = (uint)bVar14 * auVar45._28_4_ | (uint)!bVar14 * auVar50._28_4_;
            auVar47._32_4_ =
                 (uint)(bVar22 & 1) * auVar45._32_4_ | (uint)!(bool)(bVar22 & 1) * auVar50._32_4_;
            bVar14 = (bool)(bVar22 >> 1 & 1);
            auVar47._36_4_ = (uint)bVar14 * auVar45._36_4_ | (uint)!bVar14 * auVar50._36_4_;
            bVar14 = (bool)(bVar22 >> 2 & 1);
            auVar47._40_4_ = (uint)bVar14 * auVar45._40_4_ | (uint)!bVar14 * auVar50._40_4_;
            bVar14 = (bool)(bVar22 >> 3 & 1);
            auVar47._44_4_ = (uint)bVar14 * auVar45._44_4_ | (uint)!bVar14 * auVar50._44_4_;
            bVar14 = (bool)(bVar22 >> 4 & 1);
            auVar47._48_4_ = (uint)bVar14 * auVar45._48_4_ | (uint)!bVar14 * auVar50._48_4_;
            bVar14 = (bool)(bVar22 >> 5 & 1);
            auVar47._52_4_ = (uint)bVar14 * auVar45._52_4_ | (uint)!bVar14 * auVar50._52_4_;
            bVar14 = (bool)(bVar22 >> 6 & 1);
            auVar47._56_4_ = (uint)bVar14 * auVar45._56_4_ | (uint)!bVar14 * auVar50._56_4_;
            auVar47._60_4_ =
                 (uint)(bVar22 >> 7) * auVar45._60_4_ | (uint)!(bool)(bVar22 >> 7) * auVar50._60_4_;
            auVar44 = vextracti64x4_avx512f(auVar47,1);
            auVar45 = vpmulld_avx512f(auVar47,ZEXT3264(auVar44));
            auVar40 = vpmulld_avx(auVar45._0_16_,auVar45._16_16_);
            auVar43 = vpshufd_avx(auVar40,0xee);
            auVar40 = vpmulld_avx(auVar40,auVar43);
            auVar43 = vpshufd_avx(auVar40,0x55);
            auVar40 = vpmulld_avx(auVar40,auVar43);
            iVar69 = auVar40._0_4_;
          }
          uVar36 = iVar68 * *(int *)(lVar32 + 0x20);
          uVar24 = iVar70 * pTVar8[uVar29].d.bd;
          uVar30 = (ulong)uVar24;
          if (uVar36 != uVar24) goto LAB_00281290;
          uVar24 = pTVar12[uVar29].d.bd;
          uVar38 = iVar67 * *(int *)&(&pPVar5->values)[uVar29 - 1].bs.
                                     super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                                     _M_impl.super__Vector_impl_data._M_finish;
          pTVar13 = (&pPVar5->values)[uVar29 - 1].bs.
                    super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
          pfVar7 = pTVar12[uVar29].v;
          rVar2 = (this->super_Trainer).lambda;
          fVar1 = this->beta_1;
          uVar28 = *(ulong *)(lVar11 + 0x28 + uVar29 * 0x48);
          pfVar9 = pTVar8[uVar29].v;
          fStack_17c = SUB84(pfVar9,0);
          uStack_178 = (undefined4)((ulong)pfVar9 >> 0x20);
          local_148.
          super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_148.
                                 super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,fVar1);
          local_148.
          super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
          ._M_impl.super__Vector_impl_data._M_finish._4_4_ = (undefined4)uVar28;
          local_148.
          super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)(uVar28 >> 0x20);
          uVar31 = uVar30;
          if (((uVar28 & 3) == 0) &&
             (uVar31 = (ulong)(-((uint)(uVar28 >> 2) & 0x3fffffff) & 0xf), uVar30 <= uVar31)) {
            uVar31 = uVar30;
          }
          uVar33 = uVar30 - uVar31;
          uVar34 = uVar33 + 0xf;
          if (-1 < (long)uVar33) {
            uVar34 = uVar33;
          }
          auVar40 = ZEXT416((uint)((1.0 - fVar1) * fVar72));
          if (uVar31 != 0) {
            uVar35 = 0;
            do {
              auVar43 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * *(float *)(uVar28 + uVar35 * 4))),
                                        auVar40,ZEXT416((uint)pfVar9[uVar35]));
              *(int *)(uVar28 + uVar35 * 4) = auVar43._0_4_;
              uVar35 = uVar35 + 1;
            } while (uVar31 != uVar35);
          }
          uVar34 = (uVar34 & 0xfffffffffffffff0) + uVar31;
          if (0xf < (long)uVar33) {
            auVar73._0_4_ = (1.0 - fVar1) * fVar72;
            auVar73._4_4_ = fStack_184 * 0.0;
            auVar73._8_4_ = fStack_180 * 0.0;
            auVar73._12_4_ = fStack_17c * 0.0;
            auVar45 = vbroadcastss_avx512f(ZEXT416((uint)fVar1));
            auVar46 = vbroadcastss_avx512f(auVar73);
            do {
              auVar47 = vmulps_avx512f(auVar45,*(undefined1 (*) [64])(uVar28 + uVar31 * 4));
              auVar47 = vfmadd231ps_avx512f(auVar47,auVar46,*(undefined1 (*) [64])(pfVar9 + uVar31))
              ;
              *(undefined1 (*) [64])(uVar28 + uVar31 * 4) = auVar47;
              uVar31 = uVar31 + 0x10;
            } while ((long)uVar31 < (long)uVar34);
          }
          if ((long)uVar34 < (long)uVar30) {
            do {
              auVar43 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * *(float *)(uVar28 + uVar34 * 4))),
                                        auVar40,ZEXT416((uint)pfVar9[uVar34]));
              *(int *)(uVar28 + uVar34 * 4) = auVar43._0_4_;
              uVar34 = uVar34 + 1;
            } while (uVar30 != uVar34);
          }
          local_188 = fVar72;
          local_150 = p_Var27;
          if (uVar38 != uVar36) goto LAB_00281279;
          fVar1 = this->beta_2;
          local_148.
          super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_148.
                                 super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,fVar1);
          local_148.
          super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
          ._M_impl.super__Vector_impl_data._M_finish._4_4_ = SUB84(pTVar13,0);
          local_148.
          super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
               (undefined4)((ulong)pTVar13 >> 0x20);
          uVar31 = uVar30;
          if ((((ulong)pTVar13 & 3) == 0) &&
             (uVar31 = (ulong)(-((uint)((ulong)pTVar13 >> 2) & 0x3fffffff) & 0xf), uVar30 <= uVar31)
             ) {
            uVar31 = uVar30;
          }
          auVar45 = vmovdqu64_avx512f(local_b8);
          uVar33 = uVar30 - uVar31;
          uVar34 = uVar33 + 0xf;
          if (-1 < (long)uVar33) {
            uVar34 = uVar33;
          }
          fVar16 = (1.0 - fVar1) * (float)local_78._0_4_;
          auVar45 = vpermt2d_avx512f(ZEXT3264(CONCAT1616(CONCAT412(fVar72,CONCAT48(fVar72,CONCAT44(
                                                  fVar72,fVar72))),ZEXT416((uint)(1.0 - fVar1)))),
                                     auVar45,ZEXT864(pfVar9));
          auVar46 = valignd_avx512f(auVar45,auVar45,9);
          if (uVar31 != 0) {
            uVar35 = 0;
            do {
              auVar40 = vfmadd132ss_fma(ZEXT416((uint)(fVar16 * *(float *)(auVar46._0_8_ +
                                                                          uVar35 * 4))),
                                        ZEXT416((uint)(fVar1 * (float)(pTVar13->d).d[uVar35])),
                                        ZEXT416((uint)pfVar9[uVar35]));
              (pTVar13->d).d[uVar35] = auVar40._0_4_;
              uVar35 = uVar35 + 1;
            } while (uVar31 != uVar35);
          }
          uVar34 = (uVar34 & 0xfffffffffffffff0) + uVar31;
          if (0xf < (long)uVar33) {
            auVar47 = vpmovsxbd_avx512f(_DAT_002e6de0);
            auVar45 = vpermt2d_avx512f(auVar45,auVar47,ZEXT864(uVar30));
            auVar47 = vbroadcastss_avx512f(ZEXT416((uint)fVar1));
            auVar43 = vextracti32x4_avx512f(auVar45,2);
            lVar32 = vpextrq_avx(auVar43,1);
            auVar40 = vpshufd_avx(auVar45._16_16_,0xee);
            auVar45 = vbroadcastss_avx512f(ZEXT416((uint)(auVar40._0_4_ * auVar45._0_4_ * fVar72)));
            do {
              auVar48 = vmulps_avx512f(auVar47,*(undefined1 (*) [64])((pTVar13->d).d + uVar31));
              auVar49 = vmulps_avx512f(auVar45,*(undefined1 (*) [64])
                                                ((lVar32 << 0x20 | auVar43._0_8_ >> 0x20) +
                                                uVar31 * 4));
              auVar48 = vfmadd132ps_avx512f(auVar49,auVar48,*(undefined1 (*) [64])(pfVar9 + uVar31))
              ;
              *(undefined1 (*) [64])((pTVar13->d).d + uVar31) = auVar48;
              uVar31 = uVar31 + 0x10;
            } while ((long)uVar31 < (long)uVar34);
          }
          local_e8 = ZEXT416((uint)rVar2);
          if ((long)uVar34 < (long)uVar30) {
            do {
              auVar40 = vfmadd132ss_fma(ZEXT416((uint)(fVar16 * *(float *)(auVar46._0_8_ +
                                                                          uVar34 * 4))),
                                        ZEXT416((uint)(fVar1 * (float)(pTVar13->d).d[uVar34])),
                                        ZEXT416((uint)pfVar9[uVar34]));
              (pTVar13->d).d[uVar34] = auVar40._0_4_;
              uVar34 = uVar34 + 1;
            } while (uVar30 != uVar34);
          }
          local_170 = (double)(ulong)uVar38;
          dVar71 = pow((double)this->beta_1,auVar41._0_8_);
          local_d8._0_8_ = dVar71;
          dVar71 = pow((double)this->beta_2,auVar41._0_8_);
          if (uVar36 != iVar69 * uVar24) goto LAB_002812a7;
          pTVar8 = (this_00->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar30 = (ulong)pTVar8[uVar29].d.nd;
          if (uVar30 == 0) {
            auVar45 = vpbroadcastd_avx512f(ZEXT416(0xbf000000));
            auVar49 = vbroadcastss_avx512f(ZEXT416(0x3fc00000));
            auVar50 = vpbroadcastd_avx512f(ZEXT416(0x7fffffff));
            auVar51 = vbroadcastss_avx512f(ZEXT416(0x7fffff));
            auVar46 = vpbroadcastd_avx512f(ZEXT416(1));
            auVar47 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            auVar48 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            iVar68 = 1;
            in_ZMM17 = vpternlogd_avx512f(in_ZMM17,in_ZMM17,in_ZMM17,0xff);
          }
          else {
            auVar45 = vpbroadcastd_avx512f(ZEXT416(0xbf000000));
            auVar49 = vbroadcastss_avx512f(ZEXT416(0x3fc00000));
            auVar46 = vpbroadcastd_avx512f(ZEXT416(1));
            auVar50 = vpbroadcastd_avx512f(ZEXT416(0x7fffffff));
            auVar51 = vbroadcastss_avx512f(ZEXT416(0x7fffff));
            auVar47 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            auVar48 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            in_ZMM17 = vpternlogd_avx512f(in_ZMM17,in_ZMM17,in_ZMM17,0xff);
            auVar52 = vpbroadcastq_avx512f();
            uVar31 = 0;
            auVar53 = vmovdqa64_avx512f(auVar46);
            do {
              auVar54 = vpbroadcastq_avx512f();
              auVar55 = vmovdqa64_avx512f(auVar53);
              auVar53 = vporq_avx512f(auVar54,auVar47);
              auVar54 = vporq_avx512f(auVar54,auVar48);
              uVar17 = vpcmpuq_avx512f(auVar54,auVar52,2);
              bVar15 = (byte)uVar17;
              uVar17 = vpcmpuq_avx512f(auVar53,auVar52,2);
              bVar22 = (byte)uVar17;
              uVar39 = CONCAT11(bVar22,bVar15);
              auVar53 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar8[uVar29].d.d + uVar31));
              auVar60._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * auVar53._4_4_;
              auVar60._0_4_ = (uint)(bVar15 & 1) * auVar53._0_4_;
              auVar60._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * auVar53._8_4_;
              auVar60._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * auVar53._12_4_;
              auVar60._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * auVar53._16_4_;
              auVar60._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * auVar53._20_4_;
              auVar60._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * auVar53._24_4_;
              auVar60._28_4_ = (uint)((byte)(uVar39 >> 7) & 1) * auVar53._28_4_;
              auVar60._32_4_ = (uint)(bVar22 & 1) * auVar53._32_4_;
              auVar60._36_4_ = (uint)(bVar22 >> 1 & 1) * auVar53._36_4_;
              auVar60._40_4_ = (uint)(bVar22 >> 2 & 1) * auVar53._40_4_;
              auVar60._44_4_ = (uint)(bVar22 >> 3 & 1) * auVar53._44_4_;
              auVar60._48_4_ = (uint)(bVar22 >> 4 & 1) * auVar53._48_4_;
              auVar60._52_4_ = (uint)(bVar22 >> 5 & 1) * auVar53._52_4_;
              auVar60._56_4_ = (uint)(bVar22 >> 6 & 1) * auVar53._56_4_;
              auVar60._60_4_ = (uint)(bVar22 >> 7) * auVar53._60_4_;
              uVar31 = uVar31 + 0x10;
              auVar53 = vpmulld_avx512f(auVar60,auVar55);
            } while ((uVar30 + 0xf & 0x1fffffff0) != uVar31);
            auVar52 = vmovdqa32_avx512f(auVar53);
            auVar61._0_4_ =
                 (uint)(bVar15 & 1) * auVar52._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar55._0_4_;
            bVar14 = (bool)((byte)(uVar39 >> 1) & 1);
            auVar61._4_4_ = (uint)bVar14 * auVar52._4_4_ | (uint)!bVar14 * auVar55._4_4_;
            bVar14 = (bool)((byte)(uVar39 >> 2) & 1);
            auVar61._8_4_ = (uint)bVar14 * auVar52._8_4_ | (uint)!bVar14 * auVar55._8_4_;
            bVar14 = (bool)((byte)(uVar39 >> 3) & 1);
            auVar61._12_4_ = (uint)bVar14 * auVar52._12_4_ | (uint)!bVar14 * auVar55._12_4_;
            bVar14 = (bool)((byte)(uVar39 >> 4) & 1);
            auVar61._16_4_ = (uint)bVar14 * auVar52._16_4_ | (uint)!bVar14 * auVar55._16_4_;
            bVar14 = (bool)((byte)(uVar39 >> 5) & 1);
            auVar61._20_4_ = (uint)bVar14 * auVar52._20_4_ | (uint)!bVar14 * auVar55._20_4_;
            bVar14 = (bool)((byte)(uVar39 >> 6) & 1);
            auVar61._24_4_ = (uint)bVar14 * auVar52._24_4_ | (uint)!bVar14 * auVar55._24_4_;
            bVar14 = (bool)((byte)(uVar39 >> 7) & 1);
            auVar61._28_4_ = (uint)bVar14 * auVar52._28_4_ | (uint)!bVar14 * auVar55._28_4_;
            auVar61._32_4_ =
                 (uint)(bVar22 & 1) * auVar52._32_4_ | (uint)!(bool)(bVar22 & 1) * auVar55._32_4_;
            bVar14 = (bool)(bVar22 >> 1 & 1);
            auVar61._36_4_ = (uint)bVar14 * auVar52._36_4_ | (uint)!bVar14 * auVar55._36_4_;
            bVar14 = (bool)(bVar22 >> 2 & 1);
            auVar61._40_4_ = (uint)bVar14 * auVar52._40_4_ | (uint)!bVar14 * auVar55._40_4_;
            bVar14 = (bool)(bVar22 >> 3 & 1);
            auVar61._44_4_ = (uint)bVar14 * auVar52._44_4_ | (uint)!bVar14 * auVar55._44_4_;
            bVar14 = (bool)(bVar22 >> 4 & 1);
            auVar61._48_4_ = (uint)bVar14 * auVar52._48_4_ | (uint)!bVar14 * auVar55._48_4_;
            bVar14 = (bool)(bVar22 >> 5 & 1);
            auVar61._52_4_ = (uint)bVar14 * auVar52._52_4_ | (uint)!bVar14 * auVar55._52_4_;
            bVar14 = (bool)(bVar22 >> 6 & 1);
            auVar61._56_4_ = (uint)bVar14 * auVar52._56_4_ | (uint)!bVar14 * auVar55._56_4_;
            auVar61._60_4_ =
                 (uint)(bVar22 >> 7) * auVar52._60_4_ | (uint)!(bool)(bVar22 >> 7) * auVar55._60_4_;
            auVar44 = vextracti64x4_avx512f(auVar61,1);
            auVar52 = vpmulld_avx512f(auVar61,ZEXT3264(auVar44));
            auVar40 = vpmulld_avx(auVar52._0_16_,auVar52._16_16_);
            auVar43 = vpshufd_avx(auVar40,0xee);
            auVar40 = vpmulld_avx(auVar40,auVar43);
            auVar43 = vpshufd_avx(auVar40,0x55);
            auVar40 = vpmulld_avx(auVar40,auVar43);
            iVar68 = auVar40._0_4_;
          }
          local_118 = local_170;
          uVar24 = iVar68 * pTVar8[uVar29].d.bd;
          uVar30 = (ulong)uVar24;
          pfVar9 = pTVar8[uVar29].v;
          fVar72 = (float)(1.0 - (double)local_d8._0_8_);
          local_110 = (float)(1.0 - dVar71);
          local_108 = this->eps;
          local_148.
          super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_148.
                                 super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,fVar72);
          local_128 = pTVar13;
          if (uVar24 != uVar36) goto LAB_00281257;
          uVar29 = uVar30;
          if ((((ulong)pfVar9 & 3) == 0) &&
             (uVar29 = (ulong)(-((uint)((ulong)pfVar9 >> 2) & 0x3fffffff) & 0xf), uVar30 <= uVar29))
          {
            uVar29 = uVar30;
          }
          auVar20._8_4_ = 0x80000000;
          auVar20._0_8_ = 0x8000000080000000;
          auVar20._12_4_ = 0x80000000;
          auVar40 = vxorps_avx512vl(ZEXT416((uint)(this->super_Trainer).eta),auVar20);
          uVar34 = uVar30 - uVar29;
          uVar31 = uVar34 + 0xf;
          if (-1 < (long)uVar34) {
            uVar31 = uVar34;
          }
          if (uVar29 != 0) {
            uVar33 = 0;
            do {
              auVar42 = vfnmadd213ss_avx512f
                                  (ZEXT416((uint)pfVar7[uVar33]),local_e8,
                                   ZEXT416((uint)pfVar9[uVar33]));
              auVar43 = ZEXT416((uint)((1.0 / local_110) * (float)(pTVar13->d).d[uVar33]));
              auVar43 = vsqrtss_avx(auVar43,auVar43);
              pfVar9[uVar33] =
                   (auVar40._0_4_ * *(float *)(uVar28 + uVar33 * 4)) /
                   ((auVar43._0_4_ + local_108) * fVar72) + auVar42._0_4_;
              uVar33 = uVar33 + 1;
            } while (uVar29 != uVar33);
          }
          uVar31 = (uVar31 & 0xfffffffffffffff0) + uVar29;
          if (0xf < (long)uVar34) {
            auVar21._8_4_ = 0x80000000;
            auVar21._0_8_ = 0x8000000080000000;
            auVar21._12_4_ = 0x80000000;
            auVar43 = vxorps_avx512vl(local_e8,auVar21);
            auVar52 = vbroadcastss_avx512f(ZEXT416((uint)fVar72));
            auVar53 = vbroadcastss_avx512f(ZEXT416((uint)local_108));
            auVar54 = vbroadcastss_avx512f(auVar40);
            auVar55 = vbroadcastss_avx512f(auVar43);
            auVar56 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / local_110)));
            do {
              auVar57 = vmulps_avx512f(auVar56,*(undefined1 (*) [64])((pTVar13->d).d + uVar29));
              auVar62 = vmulps_avx512f(auVar54,*(undefined1 (*) [64])(uVar28 + uVar29 * 4));
              auVar63 = vrsqrt14ps_avx512f(auVar57);
              auVar64 = vmulps_avx512f(auVar57,auVar45);
              auVar65 = vpaddd_avx512f(auVar57,in_ZMM17);
              uVar18 = vptestnmd_avx512f(auVar57,auVar50);
              uVar17 = vpcmpud_avx512f(auVar65,auVar51,1);
              uVar39 = (ushort)uVar18 | (ushort)uVar17;
              auVar65 = vmulps_avx512f(auVar63,auVar63);
              auVar57 = vmulps_avx512f(auVar57,auVar63);
              auVar63 = vfmadd213ps_avx512f(auVar65,auVar64,auVar49);
              auVar57 = vfmadd213ps_avx512f(auVar57,auVar63,auVar53);
              bVar14 = (bool)((byte)uVar39 & 1);
              auVar66._0_4_ = (uint)bVar14 * auVar53._0_4_ | (uint)!bVar14 * auVar57._0_4_;
              bVar14 = (bool)((byte)(uVar39 >> 1) & 1);
              auVar66._4_4_ = (uint)bVar14 * auVar53._4_4_ | (uint)!bVar14 * auVar57._4_4_;
              bVar14 = (bool)((byte)(uVar39 >> 2) & 1);
              auVar66._8_4_ = (uint)bVar14 * auVar53._8_4_ | (uint)!bVar14 * auVar57._8_4_;
              bVar14 = (bool)((byte)(uVar39 >> 3) & 1);
              auVar66._12_4_ = (uint)bVar14 * auVar53._12_4_ | (uint)!bVar14 * auVar57._12_4_;
              bVar14 = (bool)((byte)(uVar39 >> 4) & 1);
              auVar66._16_4_ = (uint)bVar14 * auVar53._16_4_ | (uint)!bVar14 * auVar57._16_4_;
              bVar14 = (bool)((byte)(uVar39 >> 5) & 1);
              auVar66._20_4_ = (uint)bVar14 * auVar53._20_4_ | (uint)!bVar14 * auVar57._20_4_;
              bVar14 = (bool)((byte)(uVar39 >> 6) & 1);
              auVar66._24_4_ = (uint)bVar14 * auVar53._24_4_ | (uint)!bVar14 * auVar57._24_4_;
              bVar14 = (bool)((byte)(uVar39 >> 7) & 1);
              auVar66._28_4_ = (uint)bVar14 * auVar53._28_4_ | (uint)!bVar14 * auVar57._28_4_;
              bVar15 = (byte)(uVar39 >> 8);
              auVar66._32_4_ =
                   (uint)(bVar15 & 1) * auVar53._32_4_ | (uint)!(bool)(bVar15 & 1) * auVar57._32_4_;
              bVar14 = (bool)(bVar15 >> 1 & 1);
              auVar66._36_4_ = (uint)bVar14 * auVar53._36_4_ | (uint)!bVar14 * auVar57._36_4_;
              bVar14 = (bool)(bVar15 >> 2 & 1);
              auVar66._40_4_ = (uint)bVar14 * auVar53._40_4_ | (uint)!bVar14 * auVar57._40_4_;
              bVar14 = (bool)(bVar15 >> 3 & 1);
              auVar66._44_4_ = (uint)bVar14 * auVar53._44_4_ | (uint)!bVar14 * auVar57._44_4_;
              bVar14 = (bool)(bVar15 >> 4 & 1);
              auVar66._48_4_ = (uint)bVar14 * auVar53._48_4_ | (uint)!bVar14 * auVar57._48_4_;
              bVar14 = (bool)(bVar15 >> 5 & 1);
              auVar66._52_4_ = (uint)bVar14 * auVar53._52_4_ | (uint)!bVar14 * auVar57._52_4_;
              bVar14 = (bool)(bVar15 >> 6 & 1);
              auVar66._56_4_ = (uint)bVar14 * auVar53._56_4_ | (uint)!bVar14 * auVar57._56_4_;
              auVar66._60_4_ =
                   (uint)(bVar15 >> 7) * auVar53._60_4_ |
                   (uint)!(bool)(bVar15 >> 7) * auVar57._60_4_;
              auVar57 = vmulps_avx512f(auVar66,auVar52);
              auVar63 = vrcp14ps_avx512f(auVar57);
              auVar64 = vmulps_avx512f(auVar62,auVar63);
              auVar57 = vfmsub213ps_avx512f(auVar57,auVar64,auVar62);
              auVar57 = vfnmadd213ps_avx512f(auVar57,auVar63,auVar64);
              auVar62 = vfmadd213ps_avx512f(*(undefined1 (*) [64])(pfVar7 + uVar29),auVar55,
                                            *(undefined1 (*) [64])(pfVar9 + uVar29));
              auVar57 = vaddps_avx512f(auVar62,auVar57);
              *(undefined1 (*) [64])(pfVar9 + uVar29) = auVar57;
              uVar29 = uVar29 + 0x10;
            } while ((long)uVar29 < (long)uVar31);
          }
          if ((long)uVar31 < (long)uVar30) {
            do {
              auVar42 = vfnmadd213ss_avx512f
                                  (ZEXT416((uint)pfVar7[uVar31]),local_e8,
                                   ZEXT416((uint)pfVar9[uVar31]));
              auVar43 = ZEXT416((uint)((1.0 / local_110) * (float)(pTVar13->d).d[uVar31]));
              auVar43 = vsqrtss_avx(auVar43,auVar43);
              pfVar9[uVar31] =
                   (auVar40._0_4_ * *(float *)(uVar28 + uVar31 * 4)) /
                   ((auVar43._0_4_ + local_108) * fVar72) + auVar42._0_4_;
              uVar31 = uVar31 + 1;
            } while (uVar30 != uVar31);
          }
          p_Var27 = local_150->_M_nxt;
          fVar72 = (float)local_f8._0_4_;
        } while (p_Var27 != (_Hash_node_base *)0x0);
      }
      LookupParameters::clear(this_00);
      auVar48 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar47 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar46 = vpbroadcastd_avx512f(ZEXT416(1));
      local_1a0 = (ulong)((int)local_1a0 + 1);
      ppLVar26 = local_168 + 1;
      fVar72 = (float)local_f8._0_4_;
    } while (ppLVar26 != local_c0);
  }
  (this->super_Trainer).updates = (this->super_Trainer).updates + 1.0;
  return;
LAB_00281290:
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>>]"
  ;
  goto LAB_002812bc;
LAB_00281279:
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>>>]"
  ;
  goto LAB_002812bc;
LAB_002812a7:
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, c..." /* TRUNCATED STRING LITERAL */
  ;
LAB_002812bc:
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,__function);
}

Assistant:

void AdamTrainer::update(real scale) {
  unsigned pi;
  if (!shadow_params_allocated) {
    m = AllocateShadowParameters(*model);
    lm = AllocateShadowLookupParameters(*model);
    v = AllocateShadowParameters(*model);
    lv = AllocateShadowLookupParameters(*model);
    shadow_params_allocated = true;
  }

  const float gscale = clip_gradients();
  pi = 0;
  static unsigned t = 0;
  for (auto p : model->parameters_list()) {
    ++t;
    auto g_t = (scale * gscale) * p->g.vec();
    auto m_t = m[pi].h.vec();
    auto v_t = v[pi].h.vec();
    auto reg = p->values.vec() * lambda;
    m_t = beta_1 * m_t + (1 - beta_1) * g_t;
    auto g2 = g_t.cwiseProduct(g_t);
    v_t = beta_2 * v_t + (1 - beta_2) * g2;
    float s1 = 1 - pow(beta_1, t);
    float s2 = 1 - pow(beta_2, t);
    auto mhat = m_t / s1;
    auto vhat = v_t / s2;
    auto delta = (-eta * mhat).cwiseQuotient((vhat.array().sqrt() + eps).matrix());
    p->values.vec() += delta - reg;
    p->clear();
    pi++;
  }

  pi = 0;
  for (auto p : model->lookup_parameters_list()) {
    vector<Tensor>& vm = lm[pi].h;
    vector<Tensor>& vv = lv[pi].h;
    for (auto i : p->non_zero_grads) {
      auto m_t = vm[i].vec();
      auto v_t = vv[i].vec();
      auto g_t = scale * gscale * p->grads[i].vec();
      auto g2 = g_t.cwiseProduct(g_t);
      auto reg = p->values[i].vec() * lambda;
      m_t = beta_1 * m_t + (1 - beta_1) * g_t;
      v_t = beta_2 * v_t + (1 - beta_2) * g2;
      float s1 = 1 - pow(beta_1, t);
      float s2 = 1 - pow(beta_2, t);
      auto mhat = m_t / s1;
      auto vhat = v_t / s2;
      auto delta = (-eta * mhat).cwiseQuotient((vhat.array().sqrt() + eps).matrix());
      p->values[i].vec() += delta - reg;
    }
    p->clear();
    pi++;
  }
  ++updates;
}